

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<4,8>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  Primitive PVar7;
  uint uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  bool bVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  uint uVar66;
  uint uVar67;
  ulong uVar68;
  ulong uVar69;
  long lVar70;
  uint uVar71;
  long lVar72;
  uint uVar74;
  long lVar75;
  float fVar76;
  float fVar101;
  float fVar103;
  vint4 bi_1;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar102;
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar91 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar104;
  vint4 bi;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  vint4 bi_2;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar149;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar150;
  float fVar176;
  float fVar178;
  vint4 ai_1;
  undefined1 auVar152 [16];
  float fVar180;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar151;
  float fVar177;
  float fVar179;
  float fVar181;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar202;
  float fVar206;
  vint4 ai_2;
  undefined1 auVar185 [16];
  float fVar209;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar203;
  float fVar204;
  float fVar207;
  float fVar208;
  float fVar210;
  float fVar211;
  undefined1 auVar199 [32];
  float fVar205;
  float fVar212;
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar213;
  float fVar227;
  float fVar228;
  undefined1 auVar214 [16];
  float fVar229;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar242;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar235 [16];
  float fVar243;
  float fVar244;
  undefined1 auVar241 [32];
  vint4 ai;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  float fVar294;
  float fVar295;
  undefined1 auVar293 [32];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [32];
  float fVar308;
  float fVar316;
  float fVar317;
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  float fVar318;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar330;
  float fVar331;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  float fVar332;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar343 [16];
  undefined1 auVar342 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  float fVar347;
  float fVar348;
  undefined1 auVar346 [32];
  float fVar349;
  float fVar355;
  float fVar356;
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  vfloat4 a0;
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar363 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_6f0 [8];
  float fStack_6e8;
  float fStack_6e4;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5d0 [8];
  float fStack_5c8;
  float fStack_5c4;
  uint local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  RTCFilterFunctionNArguments local_4e0;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  uint auStack_450 [4];
  undefined1 local_440 [16];
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [8];
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [8];
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [8];
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  float afStack_300 [8];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 auStack_170 [16];
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar73;
  undefined1 auVar175 [32];
  undefined1 auVar362 [32];
  
  PVar7 = prim[1];
  uVar68 = (ulong)(byte)PVar7;
  lVar72 = uVar68 * 0x25;
  fVar104 = *(float *)(prim + lVar72 + 0x12);
  auVar118 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar118 = vinsertps_avx(auVar118,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar190 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar190 = vinsertps_avx(auVar190,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar118 = vsubps_avx(auVar118,*(undefined1 (*) [16])(prim + lVar72 + 6));
  auVar105._0_4_ = fVar104 * auVar118._0_4_;
  auVar105._4_4_ = fVar104 * auVar118._4_4_;
  auVar105._8_4_ = fVar104 * auVar118._8_4_;
  auVar105._12_4_ = fVar104 * auVar118._12_4_;
  auVar245._0_4_ = fVar104 * auVar190._0_4_;
  auVar245._4_4_ = fVar104 * auVar190._4_4_;
  auVar245._8_4_ = fVar104 * auVar190._8_4_;
  auVar245._12_4_ = fVar104 * auVar190._12_4_;
  auVar118 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 6)));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar190 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 5 + 6)));
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 6)));
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar268 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xf + 6)));
  auVar233 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar268 = vcvtdq2ps_avx(auVar268);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar68 + 6)));
  auVar233 = vcvtdq2ps_avx(auVar233);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1a + 6)));
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1b + 6)));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1c + 6)));
  auVar168 = vcvtdq2ps_avx(auVar168);
  auVar92 = vshufps_avx(auVar245,auVar245,0);
  auVar141 = vshufps_avx(auVar245,auVar245,0x55);
  auVar16 = vshufps_avx(auVar245,auVar245,0xaa);
  fVar104 = auVar16._0_4_;
  fVar76 = auVar16._4_4_;
  fVar101 = auVar16._8_4_;
  fVar103 = auVar16._12_4_;
  fVar182 = auVar141._0_4_;
  fVar202 = auVar141._4_4_;
  fVar206 = auVar141._8_4_;
  fVar209 = auVar141._12_4_;
  fVar150 = auVar92._0_4_;
  fVar176 = auVar92._4_4_;
  fVar178 = auVar92._8_4_;
  fVar180 = auVar92._12_4_;
  auVar323._0_4_ = fVar150 * auVar118._0_4_ + fVar182 * auVar190._0_4_ + fVar104 * auVar225._0_4_;
  auVar323._4_4_ = fVar176 * auVar118._4_4_ + fVar202 * auVar190._4_4_ + fVar76 * auVar225._4_4_;
  auVar323._8_4_ = fVar178 * auVar118._8_4_ + fVar206 * auVar190._8_4_ + fVar101 * auVar225._8_4_;
  auVar323._12_4_ =
       fVar180 * auVar118._12_4_ + fVar209 * auVar190._12_4_ + fVar103 * auVar225._12_4_;
  auVar340._0_4_ = fVar150 * auVar268._0_4_ + fVar182 * auVar233._0_4_ + auVar15._0_4_ * fVar104;
  auVar340._4_4_ = fVar176 * auVar268._4_4_ + fVar202 * auVar233._4_4_ + auVar15._4_4_ * fVar76;
  auVar340._8_4_ = fVar178 * auVar268._8_4_ + fVar206 * auVar233._8_4_ + auVar15._8_4_ * fVar101;
  auVar340._12_4_ = fVar180 * auVar268._12_4_ + fVar209 * auVar233._12_4_ + auVar15._12_4_ * fVar103
  ;
  auVar246._0_4_ = fVar150 * auVar169._0_4_ + fVar182 * auVar117._0_4_ + auVar168._0_4_ * fVar104;
  auVar246._4_4_ = fVar176 * auVar169._4_4_ + fVar202 * auVar117._4_4_ + auVar168._4_4_ * fVar76;
  auVar246._8_4_ = fVar178 * auVar169._8_4_ + fVar206 * auVar117._8_4_ + auVar168._8_4_ * fVar101;
  auVar246._12_4_ =
       fVar180 * auVar169._12_4_ + fVar209 * auVar117._12_4_ + auVar168._12_4_ * fVar103;
  auVar92 = vshufps_avx(auVar105,auVar105,0);
  auVar141 = vshufps_avx(auVar105,auVar105,0x55);
  auVar16 = vshufps_avx(auVar105,auVar105,0xaa);
  fVar104 = auVar16._0_4_;
  fVar76 = auVar16._4_4_;
  fVar101 = auVar16._8_4_;
  fVar103 = auVar16._12_4_;
  fVar182 = auVar141._0_4_;
  fVar202 = auVar141._4_4_;
  fVar206 = auVar141._8_4_;
  fVar209 = auVar141._12_4_;
  fVar150 = auVar92._0_4_;
  fVar176 = auVar92._4_4_;
  fVar178 = auVar92._8_4_;
  fVar180 = auVar92._12_4_;
  auVar106._0_4_ = fVar150 * auVar118._0_4_ + fVar182 * auVar190._0_4_ + fVar104 * auVar225._0_4_;
  auVar106._4_4_ = fVar176 * auVar118._4_4_ + fVar202 * auVar190._4_4_ + fVar76 * auVar225._4_4_;
  auVar106._8_4_ = fVar178 * auVar118._8_4_ + fVar206 * auVar190._8_4_ + fVar101 * auVar225._8_4_;
  auVar106._12_4_ =
       fVar180 * auVar118._12_4_ + fVar209 * auVar190._12_4_ + fVar103 * auVar225._12_4_;
  auVar77._0_4_ = fVar150 * auVar268._0_4_ + auVar15._0_4_ * fVar104 + fVar182 * auVar233._0_4_;
  auVar77._4_4_ = fVar176 * auVar268._4_4_ + auVar15._4_4_ * fVar76 + fVar202 * auVar233._4_4_;
  auVar77._8_4_ = fVar178 * auVar268._8_4_ + auVar15._8_4_ * fVar101 + fVar206 * auVar233._8_4_;
  auVar77._12_4_ = fVar180 * auVar268._12_4_ + auVar15._12_4_ * fVar103 + fVar209 * auVar233._12_4_;
  auVar259._8_4_ = 0x7fffffff;
  auVar259._0_8_ = 0x7fffffff7fffffff;
  auVar259._12_4_ = 0x7fffffff;
  auVar118 = vandps_avx(auVar323,auVar259);
  auVar185._8_4_ = 0x219392ef;
  auVar185._0_8_ = 0x219392ef219392ef;
  auVar185._12_4_ = 0x219392ef;
  auVar118 = vcmpps_avx(auVar118,auVar185,1);
  auVar190 = vblendvps_avx(auVar323,auVar185,auVar118);
  auVar118 = vandps_avx(auVar340,auVar259);
  auVar118 = vcmpps_avx(auVar118,auVar185,1);
  auVar225 = vblendvps_avx(auVar340,auVar185,auVar118);
  auVar118 = vandps_avx(auVar259,auVar246);
  auVar118 = vcmpps_avx(auVar118,auVar185,1);
  auVar118 = vblendvps_avx(auVar246,auVar185,auVar118);
  auVar130._0_4_ = fVar150 * auVar169._0_4_ + fVar182 * auVar117._0_4_ + auVar168._0_4_ * fVar104;
  auVar130._4_4_ = fVar176 * auVar169._4_4_ + fVar202 * auVar117._4_4_ + auVar168._4_4_ * fVar76;
  auVar130._8_4_ = fVar178 * auVar169._8_4_ + fVar206 * auVar117._8_4_ + auVar168._8_4_ * fVar101;
  auVar130._12_4_ =
       fVar180 * auVar169._12_4_ + fVar209 * auVar117._12_4_ + auVar168._12_4_ * fVar103;
  auVar268 = vrcpps_avx(auVar190);
  fVar150 = auVar268._0_4_;
  auVar152._0_4_ = fVar150 * auVar190._0_4_;
  fVar176 = auVar268._4_4_;
  auVar152._4_4_ = fVar176 * auVar190._4_4_;
  fVar178 = auVar268._8_4_;
  auVar152._8_4_ = fVar178 * auVar190._8_4_;
  fVar180 = auVar268._12_4_;
  auVar152._12_4_ = fVar180 * auVar190._12_4_;
  auVar260._8_4_ = 0x3f800000;
  auVar260._0_8_ = &DAT_3f8000003f800000;
  auVar260._12_4_ = 0x3f800000;
  auVar190 = vsubps_avx(auVar260,auVar152);
  fVar150 = fVar150 + fVar150 * auVar190._0_4_;
  fVar176 = fVar176 + fVar176 * auVar190._4_4_;
  fVar178 = fVar178 + fVar178 * auVar190._8_4_;
  fVar180 = fVar180 + fVar180 * auVar190._12_4_;
  auVar190 = vrcpps_avx(auVar225);
  fVar182 = auVar190._0_4_;
  auVar214._0_4_ = fVar182 * auVar225._0_4_;
  fVar202 = auVar190._4_4_;
  auVar214._4_4_ = fVar202 * auVar225._4_4_;
  fVar206 = auVar190._8_4_;
  auVar214._8_4_ = fVar206 * auVar225._8_4_;
  fVar209 = auVar190._12_4_;
  auVar214._12_4_ = fVar209 * auVar225._12_4_;
  auVar190 = vsubps_avx(auVar260,auVar214);
  fVar182 = fVar182 + fVar182 * auVar190._0_4_;
  fVar202 = fVar202 + fVar202 * auVar190._4_4_;
  fVar206 = fVar206 + fVar206 * auVar190._8_4_;
  fVar209 = fVar209 + fVar209 * auVar190._12_4_;
  auVar190 = vrcpps_avx(auVar118);
  fVar213 = auVar190._0_4_;
  auVar230._0_4_ = fVar213 * auVar118._0_4_;
  fVar227 = auVar190._4_4_;
  auVar230._4_4_ = fVar227 * auVar118._4_4_;
  fVar228 = auVar190._8_4_;
  auVar230._8_4_ = fVar228 * auVar118._8_4_;
  fVar229 = auVar190._12_4_;
  auVar230._12_4_ = fVar229 * auVar118._12_4_;
  auVar118 = vsubps_avx(auVar260,auVar230);
  fVar213 = fVar213 + fVar213 * auVar118._0_4_;
  fVar227 = fVar227 + fVar227 * auVar118._4_4_;
  fVar228 = fVar228 + fVar228 * auVar118._8_4_;
  fVar229 = fVar229 + fVar229 * auVar118._12_4_;
  auVar118 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar72 + 0x16)) *
                           *(float *)(prim + lVar72 + 0x1a)));
  auVar225 = vshufps_avx(auVar118,auVar118,0);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + uVar68 * 7 + 6);
  auVar118 = vpmovsxwd_avx(auVar118);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = *(ulong *)(prim + uVar68 * 0xb + 6);
  auVar190 = vpmovsxwd_avx(auVar190);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar268 = vsubps_avx(auVar190,auVar118);
  fVar104 = auVar225._0_4_;
  fVar76 = auVar225._4_4_;
  fVar101 = auVar225._8_4_;
  fVar103 = auVar225._12_4_;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = *(ulong *)(prim + uVar68 * 9 + 6);
  auVar190 = vpmovsxwd_avx(auVar225);
  auVar247._0_4_ = auVar268._0_4_ * fVar104 + auVar118._0_4_;
  auVar247._4_4_ = auVar268._4_4_ * fVar76 + auVar118._4_4_;
  auVar247._8_4_ = auVar268._8_4_ * fVar101 + auVar118._8_4_;
  auVar247._12_4_ = auVar268._12_4_ * fVar103 + auVar118._12_4_;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = *(ulong *)(prim + uVar68 * 0xd + 6);
  auVar225 = vpmovsxwd_avx(auVar268);
  auVar118 = vcvtdq2ps_avx(auVar190);
  auVar190 = vcvtdq2ps_avx(auVar225);
  auVar190 = vsubps_avx(auVar190,auVar118);
  auVar261._0_4_ = auVar190._0_4_ * fVar104 + auVar118._0_4_;
  auVar261._4_4_ = auVar190._4_4_ * fVar76 + auVar118._4_4_;
  auVar261._8_4_ = auVar190._8_4_ * fVar101 + auVar118._8_4_;
  auVar261._12_4_ = auVar190._12_4_ * fVar103 + auVar118._12_4_;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = *(ulong *)(prim + uVar68 * 0x12 + 6);
  auVar118 = vpmovsxwd_avx(auVar233);
  uVar69 = (ulong)(uint)((int)(uVar68 * 5) << 2);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar68 * 2 + uVar69 + 6);
  auVar190 = vpmovsxwd_avx(auVar15);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar190 = vsubps_avx(auVar190,auVar118);
  auVar280._0_4_ = auVar190._0_4_ * fVar104 + auVar118._0_4_;
  auVar280._4_4_ = auVar190._4_4_ * fVar76 + auVar118._4_4_;
  auVar280._8_4_ = auVar190._8_4_ * fVar101 + auVar118._8_4_;
  auVar280._12_4_ = auVar190._12_4_ * fVar103 + auVar118._12_4_;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = *(ulong *)(prim + uVar69 + 6);
  auVar118 = vpmovsxwd_avx(auVar169);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar68 * 0x18 + 6);
  auVar190 = vpmovsxwd_avx(auVar117);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar225 = vsubps_avx(auVar190,auVar118);
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *(ulong *)(prim + uVar68 * 0x1d + 6);
  auVar190 = vpmovsxwd_avx(auVar168);
  auVar296._0_4_ = auVar225._0_4_ * fVar104 + auVar118._0_4_;
  auVar296._4_4_ = auVar225._4_4_ * fVar76 + auVar118._4_4_;
  auVar296._8_4_ = auVar225._8_4_ * fVar101 + auVar118._8_4_;
  auVar296._12_4_ = auVar225._12_4_ * fVar103 + auVar118._12_4_;
  auVar118 = vcvtdq2ps_avx(auVar190);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar68 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar190 = vpmovsxwd_avx(auVar92);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar190 = vsubps_avx(auVar190,auVar118);
  auVar309._0_4_ = auVar190._0_4_ * fVar104 + auVar118._0_4_;
  auVar309._4_4_ = auVar190._4_4_ * fVar76 + auVar118._4_4_;
  auVar309._8_4_ = auVar190._8_4_ * fVar101 + auVar118._8_4_;
  auVar309._12_4_ = auVar190._12_4_ * fVar103 + auVar118._12_4_;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar68) + 6);
  auVar118 = vpmovsxwd_avx(auVar141);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar68 * 0x23 + 6);
  auVar190 = vpmovsxwd_avx(auVar16);
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar190 = vsubps_avx(auVar190,auVar118);
  auVar231._0_4_ = auVar118._0_4_ + auVar190._0_4_ * fVar104;
  auVar231._4_4_ = auVar118._4_4_ + auVar190._4_4_ * fVar76;
  auVar231._8_4_ = auVar118._8_4_ + auVar190._8_4_ * fVar101;
  auVar231._12_4_ = auVar118._12_4_ + auVar190._12_4_ * fVar103;
  auVar118 = vsubps_avx(auVar247,auVar106);
  auVar248._0_4_ = fVar150 * auVar118._0_4_;
  auVar248._4_4_ = fVar176 * auVar118._4_4_;
  auVar248._8_4_ = fVar178 * auVar118._8_4_;
  auVar248._12_4_ = fVar180 * auVar118._12_4_;
  auVar118 = vsubps_avx(auVar261,auVar106);
  auVar107._0_4_ = fVar150 * auVar118._0_4_;
  auVar107._4_4_ = fVar176 * auVar118._4_4_;
  auVar107._8_4_ = fVar178 * auVar118._8_4_;
  auVar107._12_4_ = fVar180 * auVar118._12_4_;
  auVar118 = vsubps_avx(auVar280,auVar77);
  auVar153._0_4_ = fVar182 * auVar118._0_4_;
  auVar153._4_4_ = fVar202 * auVar118._4_4_;
  auVar153._8_4_ = fVar206 * auVar118._8_4_;
  auVar153._12_4_ = fVar209 * auVar118._12_4_;
  auVar118 = vsubps_avx(auVar296,auVar77);
  auVar78._0_4_ = fVar182 * auVar118._0_4_;
  auVar78._4_4_ = fVar202 * auVar118._4_4_;
  auVar78._8_4_ = fVar206 * auVar118._8_4_;
  auVar78._12_4_ = fVar209 * auVar118._12_4_;
  auVar118 = vsubps_avx(auVar309,auVar130);
  auVar186._0_4_ = fVar213 * auVar118._0_4_;
  auVar186._4_4_ = fVar227 * auVar118._4_4_;
  auVar186._8_4_ = fVar228 * auVar118._8_4_;
  auVar186._12_4_ = fVar229 * auVar118._12_4_;
  auVar118 = vsubps_avx(auVar231,auVar130);
  auVar131._0_4_ = fVar213 * auVar118._0_4_;
  auVar131._4_4_ = fVar227 * auVar118._4_4_;
  auVar131._8_4_ = fVar228 * auVar118._8_4_;
  auVar131._12_4_ = fVar229 * auVar118._12_4_;
  auVar118 = vpminsd_avx(auVar248,auVar107);
  auVar190 = vpminsd_avx(auVar153,auVar78);
  auVar118 = vmaxps_avx(auVar118,auVar190);
  auVar190 = vpminsd_avx(auVar186,auVar131);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar262._4_4_ = uVar4;
  auVar262._0_4_ = uVar4;
  auVar262._8_4_ = uVar4;
  auVar262._12_4_ = uVar4;
  auVar190 = vmaxps_avx(auVar190,auVar262);
  auVar118 = vmaxps_avx(auVar118,auVar190);
  local_440._0_4_ = auVar118._0_4_ * 0.99999964;
  local_440._4_4_ = auVar118._4_4_ * 0.99999964;
  local_440._8_4_ = auVar118._8_4_ * 0.99999964;
  local_440._12_4_ = auVar118._12_4_ * 0.99999964;
  auVar118 = vpmaxsd_avx(auVar248,auVar107);
  auVar190 = vpmaxsd_avx(auVar153,auVar78);
  auVar118 = vminps_avx(auVar118,auVar190);
  auVar190 = vpmaxsd_avx(auVar186,auVar131);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar132._4_4_ = uVar4;
  auVar132._0_4_ = uVar4;
  auVar132._8_4_ = uVar4;
  auVar132._12_4_ = uVar4;
  auVar190 = vminps_avx(auVar190,auVar132);
  auVar118 = vminps_avx(auVar118,auVar190);
  auVar79._0_4_ = auVar118._0_4_ * 1.0000004;
  auVar79._4_4_ = auVar118._4_4_ * 1.0000004;
  auVar79._8_4_ = auVar118._8_4_ * 1.0000004;
  auVar79._12_4_ = auVar118._12_4_ * 1.0000004;
  auVar118 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar190 = vpcmpgtd_avx(auVar118,_DAT_01ff0cf0);
  auVar118 = vcmpps_avx(local_440,auVar79,2);
  auVar118 = vandps_avx(auVar118,auVar190);
  uVar66 = vmovmskps_avx(auVar118);
  if (uVar66 == 0) {
    return;
  }
  uVar66 = uVar66 & 0xff;
  auVar95._16_16_ = mm_lookupmask_ps._240_16_;
  auVar95._0_16_ = mm_lookupmask_ps._240_16_;
  local_320 = vblendps_avx(auVar95,ZEXT832(0) << 0x20,0x80);
  uVar74 = 1 << ((byte)k & 0x1f);
  uVar68 = (ulong)((uVar74 & 0xf) << 4);
  lVar72 = (long)((int)uVar74 >> 4) * 0x10;
  auVar363 = ZEXT464(0) << 0x20;
LAB_01092fa7:
  lVar70 = 0;
  if (uVar66 != 0) {
    for (; (uVar66 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
    }
  }
  uVar74 = *(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[uVar74].ptr;
  fVar104 = (pGVar9->time_range).lower;
  fVar104 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar104) / ((pGVar9->time_range).upper - fVar104));
  auVar118 = vroundss_avx(ZEXT416((uint)fVar104),ZEXT416((uint)fVar104),9);
  auVar118 = vminss_avx(auVar118,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar118 = vmaxss_avx(ZEXT816(0) << 0x20,auVar118);
  uVar8 = *(uint *)(prim + lVar70 * 4 + 6);
  uVar69 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)uVar8 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar75 = (long)(int)auVar118._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar75);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar75);
  pfVar3 = (float *)(lVar11 + lVar12 * uVar69);
  fVar76 = *pfVar3;
  fVar101 = pfVar3[1];
  fVar103 = pfVar3[2];
  fVar150 = pfVar3[3];
  lVar70 = uVar69 + 1;
  pfVar3 = (float *)(lVar11 + lVar12 * lVar70);
  fVar176 = *pfVar3;
  fVar178 = pfVar3[1];
  fVar180 = pfVar3[2];
  fVar182 = pfVar3[3];
  lVar1 = uVar69 + 2;
  pfVar3 = (float *)(lVar11 + lVar12 * lVar1);
  fVar202 = *pfVar3;
  fVar206 = pfVar3[1];
  fVar209 = pfVar3[2];
  fVar213 = pfVar3[3];
  lVar2 = uVar69 + 3;
  pfVar3 = (float *)(lVar11 + lVar12 * lVar2);
  fVar227 = *pfVar3;
  fVar228 = pfVar3[1];
  fVar229 = pfVar3[2];
  fVar102 = pfVar3[3];
  lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar11 + lVar75);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar75);
  pfVar3 = (float *)(lVar12 + lVar13 * uVar69);
  fVar151 = *pfVar3;
  fVar177 = pfVar3[1];
  fVar179 = pfVar3[2];
  fVar181 = pfVar3[3];
  pfVar3 = (float *)(lVar12 + lVar13 * lVar70);
  fVar183 = *pfVar3;
  fVar203 = pfVar3[1];
  fVar207 = pfVar3[2];
  fVar210 = pfVar3[3];
  pfVar3 = (float *)(lVar12 + lVar13 * lVar1);
  fVar149 = *pfVar3;
  fVar294 = pfVar3[1];
  fVar295 = pfVar3[2];
  fVar308 = pfVar3[3];
  fVar104 = fVar104 - auVar118._0_4_;
  pfVar3 = (float *)(lVar12 + lVar13 * lVar2);
  fVar184 = *pfVar3;
  fVar204 = pfVar3[1];
  fVar208 = pfVar3[2];
  fVar211 = pfVar3[3];
  fVar316 = auVar363._8_4_;
  fVar205 = auVar363._12_4_;
  auVar80._0_4_ = fVar176 * 0.0 + fVar202 * 0.5 + fVar227 * 0.0;
  auVar80._4_4_ = fVar178 * 0.0 + fVar206 * 0.5 + fVar228 * 0.0;
  auVar80._8_4_ = fVar316 * fVar180 + fVar209 * 0.5 + fVar229 * fVar316;
  auVar80._12_4_ = fVar205 * fVar182 + fVar213 * 0.5 + fVar102 * fVar205;
  auVar133._0_4_ = fVar76 * 0.5;
  auVar133._4_4_ = fVar101 * 0.5;
  auVar133._8_4_ = fVar103 * 0.5;
  auVar133._12_4_ = fVar150 * 0.5;
  auVar117 = vsubps_avx(auVar80,auVar133);
  auVar81._0_4_ = fVar183 * 0.0 + fVar149 * 0.5 + fVar184 * 0.0;
  auVar81._4_4_ = fVar203 * 0.0 + fVar294 * 0.5 + fVar204 * 0.0;
  auVar81._8_4_ = fVar207 * fVar316 + fVar295 * 0.5 + fVar208 * fVar316;
  auVar81._12_4_ = fVar210 * fVar205 + fVar308 * 0.5 + fVar211 * fVar205;
  auVar350._0_4_ = fVar151 * 0.5;
  auVar350._4_4_ = fVar177 * 0.5;
  auVar350._8_4_ = fVar179 * 0.5;
  auVar350._12_4_ = fVar181 * 0.5;
  auVar268 = vsubps_avx(auVar81,auVar350);
  local_6f0._0_4_ = fVar76 * -0.0 + fVar202 * 0.0 + fVar227 * -0.0 + fVar176;
  local_6f0._4_4_ = fVar101 * -0.0 + fVar206 * 0.0 + fVar228 * -0.0 + fVar178;
  fStack_6e8 = fVar103 * -0.0 + fVar316 * fVar209 + fVar229 * -0.0 + fVar180;
  fStack_6e4 = fVar150 * -0.0 + fVar205 * fVar213 + fVar102 * -0.0 + fVar182;
  local_680._0_4_ = fVar76 * -0.0 + fVar176 * 0.0 + fVar202 + fVar227 * -0.0;
  local_680._4_4_ = fVar101 * -0.0 + fVar178 * 0.0 + fVar206 + fVar228 * -0.0;
  fStack_678 = fVar103 * -0.0 + fVar316 * fVar180 + fVar209 + fVar229 * -0.0;
  fStack_674 = fVar150 * -0.0 + fVar205 * fVar182 + fVar213 + fVar102 * -0.0;
  auVar263._0_4_ = fVar202 * 0.0 + fVar227 * 0.5;
  auVar263._4_4_ = fVar206 * 0.0 + fVar228 * 0.5;
  auVar263._8_4_ = fVar316 * fVar209 + fVar229 * 0.5;
  auVar263._12_4_ = fVar205 * fVar213 + fVar102 * 0.5;
  auVar187._0_4_ = fVar176 * 0.5;
  auVar187._4_4_ = fVar178 * 0.5;
  auVar187._8_4_ = fVar180 * 0.5;
  auVar187._12_4_ = fVar182 * 0.5;
  auVar118 = vsubps_avx(auVar263,auVar187);
  auVar357._0_4_ = fVar151 * -0.0 + fVar149 * 0.0 + fVar184 * -0.0 + fVar183;
  auVar357._4_4_ = fVar177 * -0.0 + fVar294 * 0.0 + fVar204 * -0.0 + fVar203;
  auVar357._8_4_ = fVar179 * -0.0 + fVar295 * 0.0 + fVar208 * -0.0 + fVar207;
  auVar357._12_4_ = fVar181 * -0.0 + fVar308 * 0.0 + fVar211 * -0.0 + fVar210;
  auVar281._0_4_ = fVar76 * 0.0 + auVar118._0_4_;
  auVar281._4_4_ = fVar101 * 0.0 + auVar118._4_4_;
  auVar281._8_4_ = fVar103 * 0.0 + auVar118._8_4_;
  auVar281._12_4_ = fVar150 * 0.0 + auVar118._12_4_;
  auVar154._0_4_ = fVar151 * -0.0 + fVar183 * 0.0 + fVar149 + fVar184 * -0.0;
  auVar154._4_4_ = fVar177 * -0.0 + fVar203 * 0.0 + fVar294 + fVar204 * -0.0;
  auVar154._8_4_ = fVar179 * -0.0 + fVar207 * fVar316 + fVar295 + fVar208 * -0.0;
  auVar154._12_4_ = fVar181 * -0.0 + fVar210 * fVar205 + fVar308 + fVar211 * -0.0;
  auVar188._0_4_ = fVar149 * 0.0 + fVar184 * 0.5;
  auVar188._4_4_ = fVar294 * 0.0 + fVar204 * 0.5;
  auVar188._8_4_ = fVar295 * 0.0 + fVar208 * 0.5;
  auVar188._12_4_ = fVar308 * 0.0 + fVar211 * 0.5;
  auVar249._0_4_ = fVar183 * 0.5;
  auVar249._4_4_ = fVar203 * 0.5;
  auVar249._8_4_ = fVar207 * 0.5;
  auVar249._12_4_ = fVar210 * 0.5;
  auVar118 = vsubps_avx(auVar188,auVar249);
  auVar189._0_4_ = fVar151 * 0.0 + auVar118._0_4_;
  auVar189._4_4_ = fVar177 * 0.0 + auVar118._4_4_;
  auVar189._8_4_ = fVar179 * 0.0 + auVar118._8_4_;
  auVar189._12_4_ = fVar181 * 0.0 + auVar118._12_4_;
  auVar118 = vshufps_avx(auVar117,auVar117,0xc9);
  auVar190 = vshufps_avx(auVar357,auVar357,0xc9);
  fVar316 = auVar117._0_4_;
  auVar215._0_4_ = fVar316 * auVar190._0_4_;
  fVar205 = auVar117._4_4_;
  auVar215._4_4_ = fVar205 * auVar190._4_4_;
  fVar317 = auVar117._8_4_;
  auVar215._8_4_ = fVar317 * auVar190._8_4_;
  fVar212 = auVar117._12_4_;
  auVar215._12_4_ = fVar212 * auVar190._12_4_;
  auVar264._0_4_ = auVar357._0_4_ * auVar118._0_4_;
  auVar264._4_4_ = auVar357._4_4_ * auVar118._4_4_;
  auVar264._8_4_ = auVar357._8_4_ * auVar118._8_4_;
  auVar264._12_4_ = auVar357._12_4_ * auVar118._12_4_;
  auVar190 = vsubps_avx(auVar264,auVar215);
  auVar225 = vshufps_avx(auVar190,auVar190,0xc9);
  auVar190 = vshufps_avx(auVar268,auVar268,0xc9);
  auVar265._0_4_ = auVar190._0_4_ * fVar316;
  auVar265._4_4_ = auVar190._4_4_ * fVar205;
  auVar265._8_4_ = auVar190._8_4_ * fVar317;
  auVar265._12_4_ = auVar190._12_4_ * fVar212;
  auVar82._0_4_ = auVar118._0_4_ * auVar268._0_4_;
  auVar82._4_4_ = auVar118._4_4_ * auVar268._4_4_;
  auVar82._8_4_ = auVar118._8_4_ * auVar268._8_4_;
  auVar82._12_4_ = auVar118._12_4_ * auVar268._12_4_;
  auVar118 = vsubps_avx(auVar82,auVar265);
  auVar268 = vshufps_avx(auVar118,auVar118,0xc9);
  auVar118 = vshufps_avx(auVar281,auVar281,0xc9);
  auVar190 = vshufps_avx(auVar154,auVar154,0xc9);
  auVar266._0_4_ = auVar281._0_4_ * auVar190._0_4_;
  auVar266._4_4_ = auVar281._4_4_ * auVar190._4_4_;
  auVar266._8_4_ = auVar281._8_4_ * auVar190._8_4_;
  auVar266._12_4_ = auVar281._12_4_ * auVar190._12_4_;
  auVar155._0_4_ = auVar118._0_4_ * auVar154._0_4_;
  auVar155._4_4_ = auVar118._4_4_ * auVar154._4_4_;
  auVar155._8_4_ = auVar118._8_4_ * auVar154._8_4_;
  auVar155._12_4_ = auVar118._12_4_ * auVar154._12_4_;
  auVar190 = vsubps_avx(auVar155,auVar266);
  auVar233 = vshufps_avx(auVar190,auVar190,0xc9);
  auVar190 = vshufps_avx(auVar189,auVar189,0xc9);
  auVar267._0_4_ = auVar281._0_4_ * auVar190._0_4_;
  auVar267._4_4_ = auVar281._4_4_ * auVar190._4_4_;
  auVar267._8_4_ = auVar281._8_4_ * auVar190._8_4_;
  auVar267._12_4_ = auVar281._12_4_ * auVar190._12_4_;
  auVar83._0_4_ = auVar118._0_4_ * auVar189._0_4_;
  auVar83._4_4_ = auVar118._4_4_ * auVar189._4_4_;
  auVar83._8_4_ = auVar118._8_4_ * auVar189._8_4_;
  auVar83._12_4_ = auVar118._12_4_ * auVar189._12_4_;
  auVar118 = vdpps_avx(auVar225,auVar225,0x7f);
  auVar190 = vsubps_avx(auVar83,auVar267);
  auVar15 = vshufps_avx(auVar190,auVar190,0xc9);
  fVar101 = auVar118._0_4_;
  auVar92 = ZEXT416((uint)fVar101);
  auVar190 = vrsqrtss_avx(auVar92,auVar92);
  fVar76 = auVar190._0_4_;
  auVar190 = ZEXT416((uint)(fVar76 * 1.5 - fVar101 * 0.5 * fVar76 * fVar76 * fVar76));
  auVar169 = vshufps_avx(auVar190,auVar190,0);
  fVar183 = auVar169._0_4_ * auVar225._0_4_;
  fVar203 = auVar169._4_4_ * auVar225._4_4_;
  fVar207 = auVar169._8_4_ * auVar225._8_4_;
  fVar210 = auVar169._12_4_ * auVar225._12_4_;
  auVar190 = vdpps_avx(auVar225,auVar268,0x7f);
  auVar118 = vshufps_avx(auVar118,auVar118,0);
  auVar250._0_4_ = auVar118._0_4_ * auVar268._0_4_;
  auVar250._4_4_ = auVar118._4_4_ * auVar268._4_4_;
  auVar250._8_4_ = auVar118._8_4_ * auVar268._8_4_;
  auVar250._12_4_ = auVar118._12_4_ * auVar268._12_4_;
  auVar118 = vshufps_avx(auVar190,auVar190,0);
  auVar216._0_4_ = auVar118._0_4_ * auVar225._0_4_;
  auVar216._4_4_ = auVar118._4_4_ * auVar225._4_4_;
  auVar216._8_4_ = auVar118._8_4_ * auVar225._8_4_;
  auVar216._12_4_ = auVar118._12_4_ * auVar225._12_4_;
  auVar168 = vsubps_avx(auVar250,auVar216);
  auVar118 = vrcpss_avx(auVar92,auVar92);
  auVar118 = ZEXT416((uint)((2.0 - fVar101 * auVar118._0_4_) * auVar118._0_4_));
  auVar225 = vshufps_avx(auVar118,auVar118,0);
  auVar118 = vdpps_avx(auVar233,auVar233,0x7f);
  fVar149 = auVar118._0_4_;
  auVar268 = ZEXT416((uint)fVar149);
  auVar190 = vrsqrtss_avx(auVar268,auVar268);
  fVar151 = auVar190._0_4_;
  auVar190 = vdpps_avx(auVar233,auVar15,0x7f);
  auVar118 = vshufps_avx(auVar118,auVar118,0);
  auVar358._0_4_ = auVar118._0_4_ * auVar15._0_4_;
  auVar358._4_4_ = auVar118._4_4_ * auVar15._4_4_;
  auVar358._8_4_ = auVar118._8_4_ * auVar15._8_4_;
  auVar358._12_4_ = auVar118._12_4_ * auVar15._12_4_;
  lVar12 = *(long *)(_Var10 + 0x38 + lVar75);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar75);
  pfVar3 = (float *)(lVar12 + lVar13 * uVar69);
  fVar76 = *pfVar3;
  fVar101 = pfVar3[1];
  fVar103 = pfVar3[2];
  fVar150 = pfVar3[3];
  pfVar3 = (float *)(lVar12 + lVar13 * lVar70);
  fVar176 = *pfVar3;
  fVar178 = pfVar3[1];
  fVar180 = pfVar3[2];
  fVar182 = pfVar3[3];
  pfVar3 = (float *)(lVar12 + lVar13 * lVar1);
  fVar202 = *pfVar3;
  fVar206 = pfVar3[1];
  fVar209 = pfVar3[2];
  fVar213 = pfVar3[3];
  auVar118 = vshufps_avx(auVar190,auVar190,0);
  auVar84._0_4_ = auVar118._0_4_ * auVar233._0_4_;
  auVar84._4_4_ = auVar118._4_4_ * auVar233._4_4_;
  auVar84._8_4_ = auVar118._8_4_ * auVar233._8_4_;
  auVar84._12_4_ = auVar118._12_4_ * auVar233._12_4_;
  auVar15 = vsubps_avx(auVar358,auVar84);
  pfVar3 = (float *)(lVar12 + lVar13 * lVar2);
  fVar227 = *pfVar3;
  fVar228 = pfVar3[1];
  fVar229 = pfVar3[2];
  fVar102 = pfVar3[3];
  lVar12 = *(long *)(lVar11 + 0x38 + lVar75);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar75);
  auVar118 = ZEXT416((uint)(fVar151 * 1.5 - fVar149 * 0.5 * fVar151 * fVar151 * fVar151));
  auVar190 = vshufps_avx(auVar118,auVar118,0);
  fVar151 = auVar190._0_4_ * auVar233._0_4_;
  fVar177 = auVar190._4_4_ * auVar233._4_4_;
  fVar179 = auVar190._8_4_ * auVar233._8_4_;
  fVar181 = auVar190._12_4_ * auVar233._12_4_;
  auVar118 = vrcpss_avx(auVar268,auVar268);
  auVar118 = ZEXT416((uint)(auVar118._0_4_ * (2.0 - auVar118._0_4_ * fVar149)));
  auVar118 = vshufps_avx(auVar118,auVar118,0);
  auVar268 = vshufps_avx(_local_6f0,_local_6f0,0xff);
  auVar324._0_4_ = auVar268._0_4_ * fVar183;
  auVar324._4_4_ = auVar268._4_4_ * fVar203;
  auVar324._8_4_ = auVar268._8_4_ * fVar207;
  auVar324._12_4_ = auVar268._12_4_ * fVar210;
  auVar233 = vshufps_avx(auVar117,auVar117,0xff);
  auVar92 = vsubps_avx(_local_6f0,auVar324);
  auVar251._0_4_ =
       auVar233._0_4_ * fVar183 + auVar268._0_4_ * auVar169._0_4_ * auVar168._0_4_ * auVar225._0_4_;
  auVar251._4_4_ =
       auVar233._4_4_ * fVar203 + auVar268._4_4_ * auVar169._4_4_ * auVar168._4_4_ * auVar225._4_4_;
  auVar251._8_4_ =
       auVar233._8_4_ * fVar207 + auVar268._8_4_ * auVar169._8_4_ * auVar168._8_4_ * auVar225._8_4_;
  auVar251._12_4_ =
       auVar233._12_4_ * fVar210 +
       auVar268._12_4_ * auVar169._12_4_ * auVar168._12_4_ * auVar225._12_4_;
  auVar168 = vsubps_avx(auVar117,auVar251);
  local_6f0._0_4_ = auVar324._0_4_ + (float)local_6f0._0_4_;
  local_6f0._4_4_ = auVar324._4_4_ + (float)local_6f0._4_4_;
  fStack_6e8 = auVar324._8_4_ + fStack_6e8;
  fStack_6e4 = auVar324._12_4_ + fStack_6e4;
  auVar225 = vshufps_avx(_local_680,_local_680,0xff);
  auVar134._0_4_ = auVar225._0_4_ * fVar151;
  auVar134._4_4_ = auVar225._4_4_ * fVar177;
  auVar134._8_4_ = auVar225._8_4_ * fVar179;
  auVar134._12_4_ = auVar225._12_4_ * fVar181;
  auVar268 = vshufps_avx(auVar281,auVar281,0xff);
  auVar141 = vsubps_avx(_local_680,auVar134);
  auVar85._0_4_ =
       auVar268._0_4_ * fVar151 + auVar225._0_4_ * auVar190._0_4_ * auVar15._0_4_ * auVar118._0_4_;
  auVar85._4_4_ =
       auVar268._4_4_ * fVar177 + auVar225._4_4_ * auVar190._4_4_ * auVar15._4_4_ * auVar118._4_4_;
  auVar85._8_4_ =
       auVar268._8_4_ * fVar179 + auVar225._8_4_ * auVar190._8_4_ * auVar15._8_4_ * auVar118._8_4_;
  auVar85._12_4_ =
       auVar268._12_4_ * fVar181 +
       auVar225._12_4_ * auVar190._12_4_ * auVar15._12_4_ * auVar118._12_4_;
  auVar16 = vsubps_avx(auVar281,auVar85);
  local_680._0_4_ = (float)local_680._0_4_ + auVar134._0_4_;
  local_680._4_4_ = (float)local_680._4_4_ + auVar134._4_4_;
  fStack_678 = fStack_678 + auVar134._8_4_;
  fStack_674 = fStack_674 + auVar134._12_4_;
  auVar86._0_4_ = fVar176 * 0.0 + fVar202 * 0.5 + fVar227 * 0.0;
  auVar86._4_4_ = fVar178 * 0.0 + fVar206 * 0.5 + fVar228 * 0.0;
  auVar86._8_4_ = fVar180 * 0.0 + fVar209 * 0.5 + fVar229 * 0.0;
  auVar86._12_4_ = fVar182 * 0.0 + fVar213 * 0.5 + fVar102 * 0.0;
  auVar108._0_4_ = fVar76 * 0.5;
  auVar108._4_4_ = fVar101 * 0.5;
  auVar108._8_4_ = fVar103 * 0.5;
  auVar108._12_4_ = fVar150 * 0.5;
  auVar77 = vsubps_avx(auVar86,auVar108);
  pfVar3 = (float *)(lVar12 + lVar1 * lVar11);
  fVar151 = *pfVar3;
  fVar177 = pfVar3[1];
  fVar179 = pfVar3[2];
  fVar181 = pfVar3[3];
  auVar118 = *(undefined1 (*) [16])(lVar12 + lVar11 * lVar2);
  fVar184 = auVar118._0_4_;
  fVar204 = auVar118._4_4_;
  fVar208 = auVar118._8_4_;
  fVar211 = auVar118._12_4_;
  pfVar3 = (float *)(lVar12 + lVar70 * lVar11);
  fVar183 = *pfVar3;
  fVar203 = pfVar3[1];
  fVar207 = pfVar3[2];
  fVar210 = pfVar3[3];
  auVar232._0_4_ = fVar183 * 0.0 + fVar184 * 0.0 + fVar151 * 0.5;
  auVar232._4_4_ = fVar203 * 0.0 + fVar204 * 0.0 + fVar177 * 0.5;
  auVar232._8_4_ = fVar207 * 0.0 + fVar208 * 0.0 + fVar179 * 0.5;
  auVar232._12_4_ = fVar210 * 0.0 + fVar211 * 0.0 + fVar181 * 0.5;
  pfVar3 = (float *)(lVar12 + uVar69 * lVar11);
  fVar149 = *pfVar3;
  fVar294 = pfVar3[1];
  fVar295 = pfVar3[2];
  fVar308 = pfVar3[3];
  auVar269._0_4_ = fVar149 * 0.5;
  auVar269._4_4_ = fVar294 * 0.5;
  auVar269._8_4_ = fVar295 * 0.5;
  auVar269._12_4_ = fVar308 * 0.5;
  auVar190 = vsubps_avx(auVar232,auVar269);
  auVar270._0_4_ = fVar76 * -0.0 + fVar176 + fVar202 * 0.0 + fVar227 * -0.0;
  auVar270._4_4_ = fVar101 * -0.0 + fVar178 + fVar206 * 0.0 + fVar228 * -0.0;
  auVar270._8_4_ = fVar103 * -0.0 + fVar180 + fVar209 * 0.0 + fVar229 * -0.0;
  auVar270._12_4_ = fVar150 * -0.0 + fVar182 + fVar213 * 0.0 + fVar102 * -0.0;
  auVar252._0_4_ = fVar76 * -0.0 + fVar176 * 0.0 + fVar202 + fVar227 * -0.0;
  auVar252._4_4_ = fVar101 * -0.0 + fVar178 * 0.0 + fVar206 + fVar228 * -0.0;
  auVar252._8_4_ = fVar103 * -0.0 + fVar180 * 0.0 + fVar209 + fVar229 * -0.0;
  auVar252._12_4_ = fVar150 * -0.0 + fVar182 * 0.0 + fVar213 + fVar102 * -0.0;
  auVar297._0_4_ = fVar202 * 0.0 + fVar227 * 0.5;
  auVar297._4_4_ = fVar206 * 0.0 + fVar228 * 0.5;
  auVar297._8_4_ = fVar209 * 0.0 + fVar229 * 0.5;
  auVar297._12_4_ = fVar213 * 0.0 + fVar102 * 0.5;
  auVar325._0_4_ = fVar176 * 0.5;
  auVar325._4_4_ = fVar178 * 0.5;
  auVar325._8_4_ = fVar180 * 0.5;
  auVar325._12_4_ = fVar182 * 0.5;
  auVar118 = vsubps_avx(auVar297,auVar325);
  auVar310._0_4_ = fVar76 * 0.0 + auVar118._0_4_;
  auVar310._4_4_ = fVar101 * 0.0 + auVar118._4_4_;
  auVar310._8_4_ = fVar103 * 0.0 + auVar118._8_4_;
  auVar310._12_4_ = fVar150 * 0.0 + auVar118._12_4_;
  auVar298._0_4_ = fVar149 * -0.0 + fVar183 + fVar184 * -0.0 + fVar151 * 0.0;
  auVar298._4_4_ = fVar294 * -0.0 + fVar203 + fVar204 * -0.0 + fVar177 * 0.0;
  auVar298._8_4_ = fVar295 * -0.0 + fVar207 + fVar208 * -0.0 + fVar179 * 0.0;
  auVar298._12_4_ = fVar308 * -0.0 + fVar210 + fVar211 * -0.0 + fVar181 * 0.0;
  auVar109._0_4_ = fVar149 * -0.0 + fVar184 * -0.0 + fVar151 + fVar183 * 0.0;
  auVar109._4_4_ = fVar294 * -0.0 + fVar204 * -0.0 + fVar177 + fVar203 * 0.0;
  auVar109._8_4_ = fVar295 * -0.0 + fVar208 * -0.0 + fVar179 + fVar207 * 0.0;
  auVar109._12_4_ = fVar308 * -0.0 + fVar211 * -0.0 + fVar181 + fVar210 * 0.0;
  auVar135._0_4_ = fVar151 * 0.0 + fVar184 * 0.5;
  auVar135._4_4_ = fVar177 * 0.0 + fVar204 * 0.5;
  auVar135._8_4_ = fVar179 * 0.0 + fVar208 * 0.5;
  auVar135._12_4_ = fVar181 * 0.0 + fVar211 * 0.5;
  auVar156._0_4_ = fVar183 * 0.5;
  auVar156._4_4_ = fVar203 * 0.5;
  auVar156._8_4_ = fVar207 * 0.5;
  auVar156._12_4_ = fVar210 * 0.5;
  auVar118 = vsubps_avx(auVar135,auVar156);
  auVar136._0_4_ = fVar149 * 0.0 + auVar118._0_4_;
  auVar136._4_4_ = fVar294 * 0.0 + auVar118._4_4_;
  auVar136._8_4_ = fVar295 * 0.0 + auVar118._8_4_;
  auVar136._12_4_ = fVar308 * 0.0 + auVar118._12_4_;
  auVar118 = vshufps_avx(auVar298,auVar298,0xc9);
  fVar202 = auVar77._0_4_;
  auVar87._0_4_ = fVar202 * auVar118._0_4_;
  fVar206 = auVar77._4_4_;
  auVar87._4_4_ = fVar206 * auVar118._4_4_;
  fVar209 = auVar77._8_4_;
  auVar87._8_4_ = fVar209 * auVar118._8_4_;
  fVar228 = auVar77._12_4_;
  auVar87._12_4_ = fVar228 * auVar118._12_4_;
  auVar118 = vshufps_avx(auVar77,auVar77,0xc9);
  auVar299._0_4_ = auVar298._0_4_ * auVar118._0_4_;
  auVar299._4_4_ = auVar298._4_4_ * auVar118._4_4_;
  auVar299._8_4_ = auVar298._8_4_ * auVar118._8_4_;
  auVar299._12_4_ = auVar298._12_4_ * auVar118._12_4_;
  auVar225 = vsubps_avx(auVar299,auVar87);
  auVar88._0_4_ = auVar118._0_4_ * auVar190._0_4_;
  auVar88._4_4_ = auVar118._4_4_ * auVar190._4_4_;
  auVar88._8_4_ = auVar118._8_4_ * auVar190._8_4_;
  auVar88._12_4_ = auVar118._12_4_ * auVar190._12_4_;
  auVar118 = vshufps_avx(auVar190,auVar190,0xc9);
  auVar157._0_4_ = fVar202 * auVar118._0_4_;
  auVar157._4_4_ = fVar206 * auVar118._4_4_;
  auVar157._8_4_ = fVar209 * auVar118._8_4_;
  auVar157._12_4_ = fVar228 * auVar118._12_4_;
  auVar268 = vsubps_avx(auVar88,auVar157);
  auVar118 = vshufps_avx(auVar109,auVar109,0xc9);
  auVar89._0_4_ = auVar310._0_4_ * auVar118._0_4_;
  auVar89._4_4_ = auVar310._4_4_ * auVar118._4_4_;
  auVar89._8_4_ = auVar310._8_4_ * auVar118._8_4_;
  auVar89._12_4_ = auVar310._12_4_ * auVar118._12_4_;
  auVar118 = vshufps_avx(auVar310,auVar310,0xc9);
  auVar110._0_4_ = auVar118._0_4_ * auVar109._0_4_;
  auVar110._4_4_ = auVar118._4_4_ * auVar109._4_4_;
  auVar110._8_4_ = auVar118._8_4_ * auVar109._8_4_;
  auVar110._12_4_ = auVar118._12_4_ * auVar109._12_4_;
  auVar15 = vsubps_avx(auVar110,auVar89);
  auVar111._0_4_ = auVar118._0_4_ * auVar136._0_4_;
  auVar111._4_4_ = auVar118._4_4_ * auVar136._4_4_;
  auVar111._8_4_ = auVar118._8_4_ * auVar136._8_4_;
  auVar111._12_4_ = auVar118._12_4_ * auVar136._12_4_;
  auVar118 = vshufps_avx(auVar136,auVar136,0xc9);
  auVar137._0_4_ = auVar310._0_4_ * auVar118._0_4_;
  auVar137._4_4_ = auVar310._4_4_ * auVar118._4_4_;
  auVar137._8_4_ = auVar310._8_4_ * auVar118._8_4_;
  auVar137._12_4_ = auVar310._12_4_ * auVar118._12_4_;
  auVar169 = vsubps_avx(auVar111,auVar137);
  auVar225 = vshufps_avx(auVar225,auVar225,0xc9);
  auVar118 = vdpps_avx(auVar225,auVar225,0x7f);
  fVar76 = auVar118._0_4_;
  auVar233 = ZEXT416((uint)fVar76);
  auVar190 = vrsqrtss_avx(auVar233,auVar233);
  fVar101 = auVar190._0_4_;
  auVar268 = vshufps_avx(auVar268,auVar268,0xc9);
  auVar190 = vdpps_avx(auVar225,auVar268,0x7f);
  auVar118 = vshufps_avx(auVar118,auVar118,0);
  auVar158._0_4_ = auVar118._0_4_ * auVar268._0_4_;
  auVar158._4_4_ = auVar118._4_4_ * auVar268._4_4_;
  auVar158._8_4_ = auVar118._8_4_ * auVar268._8_4_;
  auVar158._12_4_ = auVar118._12_4_ * auVar268._12_4_;
  auVar118 = vshufps_avx(auVar190,auVar190,0);
  auVar326._0_4_ = auVar118._0_4_ * auVar225._0_4_;
  auVar326._4_4_ = auVar118._4_4_ * auVar225._4_4_;
  auVar326._8_4_ = auVar118._8_4_ * auVar225._8_4_;
  auVar326._12_4_ = auVar118._12_4_ * auVar225._12_4_;
  auVar78 = vsubps_avx(auVar158,auVar326);
  auVar118 = vrcpss_avx(auVar233,auVar233);
  auVar118 = ZEXT416((uint)(auVar118._0_4_ * (2.0 - fVar76 * auVar118._0_4_)));
  auVar268 = vshufps_avx(auVar118,auVar118,0);
  auVar118 = ZEXT416((uint)(fVar101 * 1.5 - fVar76 * 0.5 * fVar101 * fVar101 * fVar101));
  auVar233 = vshufps_avx(auVar118,auVar118,0);
  fVar176 = auVar225._0_4_ * auVar233._0_4_;
  fVar178 = auVar225._4_4_ * auVar233._4_4_;
  fVar180 = auVar225._8_4_ * auVar233._8_4_;
  fVar182 = auVar225._12_4_ * auVar233._12_4_;
  auVar15 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar190 = vdpps_avx(auVar15,auVar15,0x7f);
  auVar118 = vblendps_avx(auVar190,_DAT_01feba10,0xe);
  auVar225 = vrsqrtss_avx(auVar118,auVar118);
  fVar76 = auVar225._0_4_;
  auVar169 = vshufps_avx(auVar169,auVar169,0xc9);
  auVar225 = vdpps_avx(auVar15,auVar169,0x7f);
  auVar117 = vshufps_avx(auVar190,auVar190,0);
  auVar300._0_4_ = auVar117._0_4_ * auVar169._0_4_;
  auVar300._4_4_ = auVar117._4_4_ * auVar169._4_4_;
  auVar300._8_4_ = auVar117._8_4_ * auVar169._8_4_;
  auVar300._12_4_ = auVar117._12_4_ * auVar169._12_4_;
  auVar225 = vshufps_avx(auVar225,auVar225,0);
  auVar327._0_4_ = auVar225._0_4_ * auVar15._0_4_;
  auVar327._4_4_ = auVar225._4_4_ * auVar15._4_4_;
  auVar327._8_4_ = auVar225._8_4_ * auVar15._8_4_;
  auVar327._12_4_ = auVar225._12_4_ * auVar15._12_4_;
  auVar169 = vsubps_avx(auVar300,auVar327);
  auVar118 = vrcpss_avx(auVar118,auVar118);
  auVar118 = ZEXT416((uint)(auVar118._0_4_ * (2.0 - auVar190._0_4_ * auVar118._0_4_)));
  auVar118 = vshufps_avx(auVar118,auVar118,0);
  auVar190 = ZEXT416((uint)(fVar76 * 1.5 - auVar190._0_4_ * 0.5 * fVar76 * fVar76 * fVar76));
  auVar190 = vshufps_avx(auVar190,auVar190,0);
  fVar76 = auVar15._0_4_ * auVar190._0_4_;
  fVar101 = auVar15._4_4_ * auVar190._4_4_;
  fVar103 = auVar15._8_4_ * auVar190._8_4_;
  fVar150 = auVar15._12_4_ * auVar190._12_4_;
  auVar225 = vshufps_avx(auVar77,auVar77,0xff);
  auVar15 = vshufps_avx(auVar270,auVar270,0xff);
  auVar112._0_4_ = auVar15._0_4_ * fVar176;
  auVar112._4_4_ = auVar15._4_4_ * fVar178;
  auVar112._8_4_ = auVar15._8_4_ * fVar180;
  auVar112._12_4_ = auVar15._12_4_ * fVar182;
  auVar159._0_4_ =
       auVar225._0_4_ * fVar176 + auVar233._0_4_ * auVar78._0_4_ * auVar268._0_4_ * auVar15._0_4_;
  auVar159._4_4_ =
       auVar225._4_4_ * fVar178 + auVar233._4_4_ * auVar78._4_4_ * auVar268._4_4_ * auVar15._4_4_;
  auVar159._8_4_ =
       auVar225._8_4_ * fVar180 + auVar233._8_4_ * auVar78._8_4_ * auVar268._8_4_ * auVar15._8_4_;
  auVar159._12_4_ =
       auVar225._12_4_ * fVar182 +
       auVar233._12_4_ * auVar78._12_4_ * auVar268._12_4_ * auVar15._12_4_;
  auVar233 = vsubps_avx(auVar270,auVar112);
  auVar15 = vsubps_avx(auVar77,auVar159);
  auVar225 = vshufps_avx(auVar310,auVar310,0xff);
  auVar268 = vshufps_avx(auVar252,auVar252,0xff);
  auVar282._0_4_ = auVar268._0_4_ * fVar76;
  auVar282._4_4_ = auVar268._4_4_ * fVar101;
  auVar282._8_4_ = auVar268._8_4_ * fVar103;
  auVar282._12_4_ = auVar268._12_4_ * fVar150;
  auVar138._0_4_ =
       auVar225._0_4_ * fVar76 + auVar268._0_4_ * auVar190._0_4_ * auVar169._0_4_ * auVar118._0_4_;
  auVar138._4_4_ =
       auVar225._4_4_ * fVar101 + auVar268._4_4_ * auVar190._4_4_ * auVar169._4_4_ * auVar118._4_4_;
  auVar138._8_4_ =
       auVar225._8_4_ * fVar103 + auVar268._8_4_ * auVar190._8_4_ * auVar169._8_4_ * auVar118._8_4_;
  auVar138._12_4_ =
       auVar225._12_4_ * fVar150 +
       auVar268._12_4_ * auVar190._12_4_ * auVar169._12_4_ * auVar118._12_4_;
  auVar225 = vsubps_avx(auVar252,auVar282);
  auVar341._0_4_ = auVar282._0_4_ + auVar252._0_4_;
  auVar341._4_4_ = auVar282._4_4_ + auVar252._4_4_;
  auVar341._8_4_ = auVar282._8_4_ + auVar252._8_4_;
  auVar341._12_4_ = auVar282._12_4_ + auVar252._12_4_;
  auVar268 = vsubps_avx(auVar310,auVar138);
  local_620 = auVar168._0_4_;
  fStack_61c = auVar168._4_4_;
  fStack_618 = auVar168._8_4_;
  fStack_614 = auVar168._12_4_;
  local_6a0 = auVar92._0_4_;
  fStack_69c = auVar92._4_4_;
  fStack_698 = auVar92._8_4_;
  fStack_694 = auVar92._12_4_;
  auVar118 = vshufps_avx(ZEXT416((uint)fVar104),ZEXT416((uint)fVar104),0);
  auVar190 = vshufps_avx(ZEXT416((uint)(1.0 - fVar104)),ZEXT416((uint)(1.0 - fVar104)),0);
  fVar150 = auVar118._0_4_;
  fVar176 = auVar118._4_4_;
  fVar178 = auVar118._8_4_;
  fVar180 = auVar118._12_4_;
  fVar104 = auVar190._0_4_;
  fVar76 = auVar190._4_4_;
  fVar101 = auVar190._8_4_;
  fVar103 = auVar190._12_4_;
  local_480._0_4_ = fVar104 * local_6a0 + fVar150 * auVar233._0_4_;
  local_480._4_4_ = fVar76 * fStack_69c + fVar176 * auVar233._4_4_;
  fStack_478 = fVar101 * fStack_698 + fVar178 * auVar233._8_4_;
  fStack_474 = fVar103 * fStack_694 + fVar180 * auVar233._12_4_;
  fVar213 = fVar104 * (local_6a0 + local_620 * 0.33333334) +
            fVar150 * (auVar233._0_4_ + auVar15._0_4_ * 0.33333334);
  fVar229 = fVar76 * (fStack_69c + fStack_61c * 0.33333334) +
            fVar176 * (auVar233._4_4_ + auVar15._4_4_ * 0.33333334);
  fVar177 = fVar101 * (fStack_698 + fStack_618 * 0.33333334) +
            fVar178 * (auVar233._8_4_ + auVar15._8_4_ * 0.33333334);
  fVar183 = fVar103 * (fStack_694 + fStack_614 * 0.33333334) +
            fVar180 * (auVar233._12_4_ + auVar15._12_4_ * 0.33333334);
  local_5f0 = auVar16._0_4_;
  fStack_5ec = auVar16._4_4_;
  fStack_5e8 = auVar16._8_4_;
  fStack_5e4 = auVar16._12_4_;
  auVar139._0_4_ = local_5f0 * 0.33333334;
  auVar139._4_4_ = fStack_5ec * 0.33333334;
  auVar139._8_4_ = fStack_5e8 * 0.33333334;
  auVar139._12_4_ = fStack_5e4 * 0.33333334;
  auVar118 = vsubps_avx(auVar141,auVar139);
  auVar234._0_4_ = (auVar281._0_4_ + auVar85._0_4_) * 0.33333334;
  auVar234._4_4_ = (auVar281._4_4_ + auVar85._4_4_) * 0.33333334;
  auVar234._8_4_ = (auVar281._8_4_ + auVar85._8_4_) * 0.33333334;
  auVar234._12_4_ = (auVar281._12_4_ + auVar85._12_4_) * 0.33333334;
  auVar190 = vsubps_avx(_local_680,auVar234);
  auVar160._0_4_ = auVar268._0_4_ * 0.33333334;
  auVar160._4_4_ = auVar268._4_4_ * 0.33333334;
  auVar160._8_4_ = auVar268._8_4_ * 0.33333334;
  auVar160._12_4_ = auVar268._12_4_ * 0.33333334;
  auVar268 = vsubps_avx(auVar225,auVar160);
  auVar301._0_4_ = (auVar310._0_4_ + auVar138._0_4_) * 0.33333334;
  auVar301._4_4_ = (auVar310._4_4_ + auVar138._4_4_) * 0.33333334;
  auVar301._8_4_ = (auVar310._8_4_ + auVar138._8_4_) * 0.33333334;
  auVar301._12_4_ = (auVar310._12_4_ + auVar138._12_4_) * 0.33333334;
  auVar233 = vsubps_avx(auVar341,auVar301);
  local_490._0_4_ = fVar150 * auVar268._0_4_ + fVar104 * auVar118._0_4_;
  local_490._4_4_ = fVar176 * auVar268._4_4_ + fVar76 * auVar118._4_4_;
  fStack_488 = fVar178 * auVar268._8_4_ + fVar101 * auVar118._8_4_;
  fStack_484 = fVar180 * auVar268._12_4_ + fVar103 * auVar118._12_4_;
  fVar227 = fVar104 * auVar141._0_4_ + fVar150 * auVar225._0_4_;
  fVar102 = fVar76 * auVar141._4_4_ + fVar176 * auVar225._4_4_;
  fVar179 = fVar101 * auVar141._8_4_ + fVar178 * auVar225._8_4_;
  fVar203 = fVar103 * auVar141._12_4_ + fVar180 * auVar225._12_4_;
  local_4a0._0_4_ = (float)local_6f0._0_4_ * fVar104 + fVar150 * (auVar270._0_4_ + auVar112._0_4_);
  local_4a0._4_4_ = (float)local_6f0._4_4_ * fVar76 + fVar176 * (auVar270._4_4_ + auVar112._4_4_);
  fStack_498 = fStack_6e8 * fVar101 + fVar178 * (auVar270._8_4_ + auVar112._8_4_);
  fStack_494 = fStack_6e4 * fVar103 + fVar180 * (auVar270._12_4_ + auVar112._12_4_);
  local_4b0._0_4_ =
       fVar104 * ((float)local_6f0._0_4_ + (fVar316 + auVar251._0_4_) * 0.33333334) +
       fVar150 * (auVar270._0_4_ + auVar112._0_4_ + (fVar202 + auVar159._0_4_) * 0.33333334);
  local_4b0._4_4_ =
       fVar76 * ((float)local_6f0._4_4_ + (fVar205 + auVar251._4_4_) * 0.33333334) +
       fVar176 * (auVar270._4_4_ + auVar112._4_4_ + (fVar206 + auVar159._4_4_) * 0.33333334);
  fStack_4a8 = fVar101 * (fStack_6e8 + (fVar317 + auVar251._8_4_) * 0.33333334) +
               fVar178 * (auVar270._8_4_ + auVar112._8_4_ + (fVar209 + auVar159._8_4_) * 0.33333334)
  ;
  fStack_4a4 = fVar103 * (fStack_6e4 + (fVar212 + auVar251._12_4_) * 0.33333334) +
               fVar180 * (auVar270._12_4_ + auVar112._12_4_ +
                         (fVar228 + auVar159._12_4_) * 0.33333334);
  fVar228 = fVar104 * auVar190._0_4_ + fVar150 * auVar233._0_4_;
  fVar151 = fVar76 * auVar190._4_4_ + fVar176 * auVar233._4_4_;
  fVar181 = fVar101 * auVar190._8_4_ + fVar178 * auVar233._8_4_;
  fVar207 = fVar103 * auVar190._12_4_ + fVar180 * auVar233._12_4_;
  auVar118 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  local_3f0._0_4_ = (float)local_680._0_4_ * fVar104 + fVar150 * auVar341._0_4_;
  local_3f0._4_4_ = (float)local_680._4_4_ * fVar76 + fVar176 * auVar341._4_4_;
  fStack_3e8 = fStack_678 * fVar101 + fVar178 * auVar341._8_4_;
  fStack_3e4 = fStack_674 * fVar103 + fVar180 * auVar341._12_4_;
  auVar118 = vinsertps_avx(auVar118,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_360 = vsubps_avx(_local_480,auVar118);
  auVar225 = vmovsldup_avx(local_360);
  auVar190 = vmovshdup_avx(local_360);
  auVar268 = vshufps_avx(local_360,local_360,0xaa);
  fVar104 = pre->ray_space[k].vx.field_0.m128[0];
  fVar76 = pre->ray_space[k].vx.field_0.m128[1];
  fVar101 = pre->ray_space[k].vx.field_0.m128[2];
  fVar103 = pre->ray_space[k].vx.field_0.m128[3];
  fVar150 = pre->ray_space[k].vy.field_0.m128[0];
  fVar176 = pre->ray_space[k].vy.field_0.m128[1];
  fVar178 = pre->ray_space[k].vy.field_0.m128[2];
  fVar180 = pre->ray_space[k].vy.field_0.m128[3];
  fVar182 = pre->ray_space[k].vz.field_0.m128[0];
  fVar202 = pre->ray_space[k].vz.field_0.m128[1];
  fVar206 = pre->ray_space[k].vz.field_0.m128[2];
  fVar209 = pre->ray_space[k].vz.field_0.m128[3];
  local_5d0._0_4_ = fVar104 * auVar225._0_4_ + fVar150 * auVar190._0_4_ + fVar182 * auVar268._0_4_;
  local_5d0._4_4_ = fVar76 * auVar225._4_4_ + fVar176 * auVar190._4_4_ + fVar202 * auVar268._4_4_;
  fStack_5c8 = fVar101 * auVar225._8_4_ + fVar178 * auVar190._8_4_ + fVar206 * auVar268._8_4_;
  fStack_5c4 = fVar103 * auVar225._12_4_ + fVar180 * auVar190._12_4_ + fVar209 * auVar268._12_4_;
  auVar60._4_4_ = fVar229;
  auVar60._0_4_ = fVar213;
  auVar60._8_4_ = fVar177;
  auVar60._12_4_ = fVar183;
  local_370 = vsubps_avx(auVar60,auVar118);
  auVar268 = vshufps_avx(local_370,local_370,0xaa);
  auVar190 = vmovshdup_avx(local_370);
  auVar225 = vmovsldup_avx(local_370);
  auVar342._0_8_ =
       CONCAT44(fVar76 * auVar225._4_4_ + fVar176 * auVar190._4_4_ + fVar202 * auVar268._4_4_,
                fVar104 * auVar225._0_4_ + fVar150 * auVar190._0_4_ + fVar182 * auVar268._0_4_);
  auVar342._8_4_ = fVar101 * auVar225._8_4_ + fVar178 * auVar190._8_4_ + fVar206 * auVar268._8_4_;
  auVar342._12_4_ =
       fVar103 * auVar225._12_4_ + fVar180 * auVar190._12_4_ + fVar209 * auVar268._12_4_;
  local_380 = vsubps_avx(_local_490,auVar118);
  auVar268 = vshufps_avx(local_380,local_380,0xaa);
  auVar190 = vmovshdup_avx(local_380);
  auVar225 = vmovsldup_avx(local_380);
  auVar351._0_4_ = fVar104 * auVar225._0_4_ + fVar150 * auVar190._0_4_ + fVar182 * auVar268._0_4_;
  auVar351._4_4_ = fVar76 * auVar225._4_4_ + fVar176 * auVar190._4_4_ + fVar202 * auVar268._4_4_;
  auVar351._8_4_ = fVar101 * auVar225._8_4_ + fVar178 * auVar190._8_4_ + fVar206 * auVar268._8_4_;
  auVar351._12_4_ =
       fVar103 * auVar225._12_4_ + fVar180 * auVar190._12_4_ + fVar209 * auVar268._12_4_;
  auVar58._4_4_ = fVar102;
  auVar58._0_4_ = fVar227;
  auVar58._8_4_ = fVar179;
  auVar58._12_4_ = fVar203;
  local_390 = vsubps_avx(auVar58,auVar118);
  auVar268 = vshufps_avx(local_390,local_390,0xaa);
  auVar190 = vmovshdup_avx(local_390);
  auVar225 = vmovsldup_avx(local_390);
  auVar253._0_4_ = auVar225._0_4_ * fVar104 + auVar190._0_4_ * fVar150 + fVar182 * auVar268._0_4_;
  auVar253._4_4_ = auVar225._4_4_ * fVar76 + auVar190._4_4_ * fVar176 + fVar202 * auVar268._4_4_;
  auVar253._8_4_ = auVar225._8_4_ * fVar101 + auVar190._8_4_ * fVar178 + fVar206 * auVar268._8_4_;
  auVar253._12_4_ =
       auVar225._12_4_ * fVar103 + auVar190._12_4_ * fVar180 + fVar209 * auVar268._12_4_;
  local_3a0 = vsubps_avx(_local_4a0,auVar118);
  auVar268 = vshufps_avx(local_3a0,local_3a0,0xaa);
  auVar190 = vmovshdup_avx(local_3a0);
  auVar225 = vmovsldup_avx(local_3a0);
  auVar271._0_4_ = auVar225._0_4_ * fVar104 + auVar190._0_4_ * fVar150 + auVar268._0_4_ * fVar182;
  auVar271._4_4_ = auVar225._4_4_ * fVar76 + auVar190._4_4_ * fVar176 + auVar268._4_4_ * fVar202;
  auVar271._8_4_ = auVar225._8_4_ * fVar101 + auVar190._8_4_ * fVar178 + auVar268._8_4_ * fVar206;
  auVar271._12_4_ =
       auVar225._12_4_ * fVar103 + auVar190._12_4_ * fVar180 + auVar268._12_4_ * fVar209;
  local_3b0 = vsubps_avx(_local_4b0,auVar118);
  auVar268 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar190 = vmovshdup_avx(local_3b0);
  auVar225 = vmovsldup_avx(local_3b0);
  auVar283._0_4_ = auVar225._0_4_ * fVar104 + auVar190._0_4_ * fVar150 + auVar268._0_4_ * fVar182;
  auVar283._4_4_ = auVar225._4_4_ * fVar76 + auVar190._4_4_ * fVar176 + auVar268._4_4_ * fVar202;
  auVar283._8_4_ = auVar225._8_4_ * fVar101 + auVar190._8_4_ * fVar178 + auVar268._8_4_ * fVar206;
  auVar283._12_4_ =
       auVar225._12_4_ * fVar103 + auVar190._12_4_ * fVar180 + auVar268._12_4_ * fVar209;
  auVar56._4_4_ = fVar151;
  auVar56._0_4_ = fVar228;
  auVar56._8_4_ = fVar181;
  auVar56._12_4_ = fVar207;
  local_3c0 = vsubps_avx(auVar56,auVar118);
  auVar268 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar190 = vmovshdup_avx(local_3c0);
  auVar225 = vmovsldup_avx(local_3c0);
  auVar302._0_4_ = auVar225._0_4_ * fVar104 + auVar190._0_4_ * fVar150 + auVar268._0_4_ * fVar182;
  auVar302._4_4_ = auVar225._4_4_ * fVar76 + auVar190._4_4_ * fVar176 + auVar268._4_4_ * fVar202;
  auVar302._8_4_ = auVar225._8_4_ * fVar101 + auVar190._8_4_ * fVar178 + auVar268._8_4_ * fVar206;
  auVar302._12_4_ =
       auVar225._12_4_ * fVar103 + auVar190._12_4_ * fVar180 + auVar268._12_4_ * fVar209;
  local_3d0 = vsubps_avx(_local_3f0,auVar118);
  auVar225 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar118 = vmovshdup_avx(local_3d0);
  auVar190 = vmovsldup_avx(local_3d0);
  auVar90._0_4_ = fVar104 * auVar190._0_4_ + fVar150 * auVar118._0_4_ + fVar182 * auVar225._0_4_;
  auVar90._4_4_ = fVar76 * auVar190._4_4_ + fVar176 * auVar118._4_4_ + fVar202 * auVar225._4_4_;
  auVar90._8_4_ = fVar101 * auVar190._8_4_ + fVar178 * auVar118._8_4_ + fVar206 * auVar225._8_4_;
  auVar90._12_4_ = fVar103 * auVar190._12_4_ + fVar180 * auVar118._12_4_ + fVar209 * auVar225._12_4_
  ;
  auVar268 = vmovlhps_avx(_local_5d0,auVar271);
  auVar233 = vmovlhps_avx(auVar342,auVar283);
  auVar15 = vmovlhps_avx(auVar351,auVar302);
  _local_470 = vmovlhps_avx(auVar253,auVar90);
  auVar118 = vminps_avx(auVar268,auVar233);
  auVar190 = vminps_avx(auVar15,_local_470);
  auVar225 = vminps_avx(auVar118,auVar190);
  auVar118 = vmaxps_avx(auVar268,auVar233);
  auVar190 = vmaxps_avx(auVar15,_local_470);
  auVar118 = vmaxps_avx(auVar118,auVar190);
  auVar190 = vshufpd_avx(auVar225,auVar225,3);
  auVar225 = vminps_avx(auVar225,auVar190);
  auVar190 = vshufpd_avx(auVar118,auVar118,3);
  auVar190 = vmaxps_avx(auVar118,auVar190);
  auVar235._8_4_ = 0x7fffffff;
  auVar235._0_8_ = 0x7fffffff7fffffff;
  auVar235._12_4_ = 0x7fffffff;
  auVar118 = vandps_avx(auVar225,auVar235);
  auVar190 = vandps_avx(auVar190,auVar235);
  auVar118 = vmaxps_avx(auVar118,auVar190);
  auVar190 = vmovshdup_avx(auVar118);
  auVar118 = vmaxss_avx(auVar190,auVar118);
  local_508 = uVar66 + 0xf;
  fVar76 = auVar118._0_4_ * 9.536743e-07;
  register0x00001548 = auVar342._0_8_;
  local_460 = auVar342._0_8_;
  auVar118 = vshufps_avx(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76),0);
  local_280._16_16_ = auVar118;
  local_280._0_16_ = auVar118;
  auVar91._0_8_ = auVar118._0_8_ ^ 0x8000000080000000;
  auVar91._8_4_ = auVar118._8_4_ ^ 0x80000000;
  auVar91._12_4_ = auVar118._12_4_ ^ 0x80000000;
  local_2a0._16_16_ = auVar91;
  local_2a0._0_16_ = auVar91;
  auVar118 = vshufps_avx(ZEXT416(uVar74),ZEXT416(uVar74),0);
  local_2c0._16_16_ = auVar118;
  local_2c0._0_16_ = auVar118;
  auVar118 = vpshufd_avx(ZEXT416(uVar8),0);
  local_2e0._16_16_ = auVar118;
  local_2e0._0_16_ = auVar118;
  uVar69 = 0;
  fVar104 = *(float *)(ray + k * 4 + 0x60);
  _local_330 = vsubps_avx(auVar233,auVar268);
  _local_340 = vsubps_avx(auVar15,auVar233);
  _local_350 = vsubps_avx(_local_470,auVar15);
  _local_400 = vsubps_avx(_local_4a0,_local_480);
  auVar61._4_4_ = fVar229;
  auVar61._0_4_ = fVar213;
  auVar61._8_4_ = fVar177;
  auVar61._12_4_ = fVar183;
  _local_410 = vsubps_avx(_local_4b0,auVar61);
  auVar57._4_4_ = fVar151;
  auVar57._0_4_ = fVar228;
  auVar57._8_4_ = fVar181;
  auVar57._12_4_ = fVar207;
  _local_420 = vsubps_avx(auVar57,_local_490);
  auVar59._4_4_ = fVar102;
  auVar59._0_4_ = fVar227;
  auVar59._8_4_ = fVar179;
  auVar59._12_4_ = fVar203;
  _local_430 = vsubps_avx(_local_3f0,auVar59);
  _local_6f0 = ZEXT816(0x3f80000000000000);
  local_3e0 = _local_6f0;
  do {
    auVar118 = vshufps_avx(_local_6f0,_local_6f0,0x50);
    auVar359._8_4_ = 0x3f800000;
    auVar359._0_8_ = &DAT_3f8000003f800000;
    auVar359._12_4_ = 0x3f800000;
    auVar362._16_4_ = 0x3f800000;
    auVar362._0_16_ = auVar359;
    auVar362._20_4_ = 0x3f800000;
    auVar362._24_4_ = 0x3f800000;
    auVar362._28_4_ = 0x3f800000;
    auVar190 = vsubps_avx(auVar359,auVar118);
    fVar101 = auVar118._0_4_;
    fVar103 = auVar118._4_4_;
    fVar150 = auVar118._8_4_;
    fVar176 = auVar118._12_4_;
    fVar178 = auVar190._0_4_;
    fVar180 = auVar190._4_4_;
    fVar182 = auVar190._8_4_;
    fVar202 = auVar190._12_4_;
    auVar140._0_4_ = auVar271._0_4_ * fVar101 + fVar178 * (float)local_5d0._0_4_;
    auVar140._4_4_ = auVar271._4_4_ * fVar103 + fVar180 * (float)local_5d0._4_4_;
    auVar140._8_4_ = auVar271._0_4_ * fVar150 + fVar182 * (float)local_5d0._0_4_;
    auVar140._12_4_ = auVar271._4_4_ * fVar176 + fVar202 * (float)local_5d0._4_4_;
    auVar113._0_4_ = auVar283._0_4_ * fVar101 + local_460._0_4_ * fVar178;
    auVar113._4_4_ = auVar283._4_4_ * fVar103 + local_460._4_4_ * fVar180;
    auVar113._8_4_ = auVar283._0_4_ * fVar150 + local_460._8_4_ * fVar182;
    auVar113._12_4_ = auVar283._4_4_ * fVar176 + local_460._12_4_ * fVar202;
    auVar254._0_4_ = auVar302._0_4_ * fVar101 + auVar351._0_4_ * fVar178;
    auVar254._4_4_ = auVar302._4_4_ * fVar103 + auVar351._4_4_ * fVar180;
    auVar254._8_4_ = auVar302._0_4_ * fVar150 + auVar351._0_4_ * fVar182;
    auVar254._12_4_ = auVar302._4_4_ * fVar176 + auVar351._4_4_ * fVar202;
    auVar161._0_4_ = auVar90._0_4_ * fVar101 + auVar253._0_4_ * fVar178;
    auVar161._4_4_ = auVar90._4_4_ * fVar103 + auVar253._4_4_ * fVar180;
    auVar161._8_4_ = auVar90._0_4_ * fVar150 + auVar253._0_4_ * fVar182;
    auVar161._12_4_ = auVar90._4_4_ * fVar176 + auVar253._4_4_ * fVar202;
    auVar118 = vmovshdup_avx(local_3e0);
    auVar190 = vshufps_avx(local_3e0,local_3e0,0);
    auVar278._16_16_ = auVar190;
    auVar278._0_16_ = auVar190;
    auVar225 = vshufps_avx(local_3e0,local_3e0,0x55);
    auVar96._16_16_ = auVar225;
    auVar96._0_16_ = auVar225;
    auVar95 = vsubps_avx(auVar96,auVar278);
    auVar225 = vshufps_avx(auVar140,auVar140,0);
    auVar169 = vshufps_avx(auVar140,auVar140,0x55);
    auVar117 = vshufps_avx(auVar113,auVar113,0);
    auVar168 = vshufps_avx(auVar113,auVar113,0x55);
    auVar92 = vshufps_avx(auVar254,auVar254,0);
    auVar141 = vshufps_avx(auVar254,auVar254,0x55);
    auVar16 = vshufps_avx(auVar161,auVar161,0);
    auVar77 = vshufps_avx(auVar161,auVar161,0x55);
    auVar118 = ZEXT416((uint)((auVar118._0_4_ - local_3e0._0_4_) * 0.04761905));
    auVar118 = vshufps_avx(auVar118,auVar118,0);
    auVar293._0_4_ = auVar190._0_4_ + auVar95._0_4_ * 0.0;
    auVar293._4_4_ = auVar190._4_4_ + auVar95._4_4_ * 0.14285715;
    auVar293._8_4_ = auVar190._8_4_ + auVar95._8_4_ * 0.2857143;
    auVar293._12_4_ = auVar190._12_4_ + auVar95._12_4_ * 0.42857146;
    auVar293._16_4_ = auVar190._0_4_ + auVar95._16_4_ * 0.5714286;
    auVar293._20_4_ = auVar190._4_4_ + auVar95._20_4_ * 0.71428573;
    auVar293._24_4_ = auVar190._8_4_ + auVar95._24_4_ * 0.8571429;
    auVar293._28_4_ = auVar190._12_4_ + auVar95._28_4_;
    auVar19 = vsubps_avx(auVar362,auVar293);
    fVar295 = auVar117._0_4_;
    fVar184 = auVar117._4_4_;
    fVar205 = auVar117._8_4_;
    fVar212 = auVar117._12_4_;
    fVar101 = auVar19._0_4_;
    fVar178 = auVar19._4_4_;
    fVar206 = auVar19._8_4_;
    fVar294 = auVar19._12_4_;
    fVar347 = auVar225._12_4_;
    fVar204 = auVar19._16_4_;
    fVar208 = auVar19._20_4_;
    fVar211 = auVar19._24_4_;
    fVar242 = auVar168._0_4_;
    fVar243 = auVar168._4_4_;
    fVar244 = auVar168._8_4_;
    fVar339 = auVar168._12_4_;
    local_660 = auVar169._0_4_;
    fStack_65c = auVar169._4_4_;
    fStack_658 = auVar169._8_4_;
    fStack_654 = auVar169._12_4_;
    fVar103 = auVar92._0_4_;
    fVar176 = auVar92._4_4_;
    fVar182 = auVar92._8_4_;
    fVar209 = auVar92._12_4_;
    fVar308 = auVar293._0_4_ * fVar103 + fVar295 * fVar101;
    fVar316 = auVar293._4_4_ * fVar176 + fVar184 * fVar178;
    fVar317 = auVar293._8_4_ * fVar182 + fVar205 * fVar206;
    fVar318 = auVar293._12_4_ * fVar209 + fVar212 * fVar294;
    fVar319 = auVar293._16_4_ * fVar103 + fVar295 * fVar204;
    fVar320 = auVar293._20_4_ * fVar176 + fVar184 * fVar208;
    fVar321 = auVar293._24_4_ * fVar182 + fVar205 * fVar211;
    fVar150 = auVar141._0_4_;
    fVar180 = auVar141._4_4_;
    fVar202 = auVar141._8_4_;
    fVar210 = auVar141._12_4_;
    fVar322 = auVar293._0_4_ * fVar150 + fVar242 * fVar101;
    fVar330 = auVar293._4_4_ * fVar180 + fVar243 * fVar178;
    fVar331 = auVar293._8_4_ * fVar202 + fVar244 * fVar206;
    fVar332 = auVar293._12_4_ * fVar210 + fVar339 * fVar294;
    fVar333 = auVar293._16_4_ * fVar150 + fVar242 * fVar204;
    fVar335 = auVar293._20_4_ * fVar180 + fVar243 * fVar208;
    fVar337 = auVar293._24_4_ * fVar202 + fVar244 * fVar211;
    auVar190 = vshufps_avx(auVar140,auVar140,0xaa);
    auVar169 = vshufps_avx(auVar140,auVar140,0xff);
    fVar149 = fVar209 + 0.0;
    auVar117 = vshufps_avx(auVar113,auVar113,0xaa);
    auVar168 = vshufps_avx(auVar113,auVar113,0xff);
    auVar97._0_4_ =
         fVar101 * (fVar295 * auVar293._0_4_ + auVar225._0_4_ * fVar101) + auVar293._0_4_ * fVar308;
    auVar97._4_4_ =
         fVar178 * (fVar184 * auVar293._4_4_ + auVar225._4_4_ * fVar178) + auVar293._4_4_ * fVar316;
    auVar97._8_4_ =
         fVar206 * (fVar205 * auVar293._8_4_ + auVar225._8_4_ * fVar206) + auVar293._8_4_ * fVar317;
    auVar97._12_4_ =
         fVar294 * (fVar212 * auVar293._12_4_ + fVar347 * fVar294) + auVar293._12_4_ * fVar318;
    auVar97._16_4_ =
         fVar204 * (fVar295 * auVar293._16_4_ + auVar225._0_4_ * fVar204) +
         auVar293._16_4_ * fVar319;
    auVar97._20_4_ =
         fVar208 * (fVar184 * auVar293._20_4_ + auVar225._4_4_ * fVar208) +
         auVar293._20_4_ * fVar320;
    auVar97._24_4_ =
         fVar211 * (fVar205 * auVar293._24_4_ + auVar225._8_4_ * fVar211) +
         auVar293._24_4_ * fVar321;
    auVar97._28_4_ = fVar347 + 1.0 + fVar210;
    auVar172._0_4_ =
         fVar101 * (fVar242 * auVar293._0_4_ + fVar101 * local_660) + auVar293._0_4_ * fVar322;
    auVar172._4_4_ =
         fVar178 * (fVar243 * auVar293._4_4_ + fVar178 * fStack_65c) + auVar293._4_4_ * fVar330;
    auVar172._8_4_ =
         fVar206 * (fVar244 * auVar293._8_4_ + fVar206 * fStack_658) + auVar293._8_4_ * fVar331;
    auVar172._12_4_ =
         fVar294 * (fVar339 * auVar293._12_4_ + fVar294 * fStack_654) + auVar293._12_4_ * fVar332;
    auVar172._16_4_ =
         fVar204 * (fVar242 * auVar293._16_4_ + fVar204 * local_660) + auVar293._16_4_ * fVar333;
    auVar172._20_4_ =
         fVar208 * (fVar243 * auVar293._20_4_ + fVar208 * fStack_65c) + auVar293._20_4_ * fVar335;
    auVar172._24_4_ =
         fVar211 * (fVar244 * auVar293._24_4_ + fVar211 * fStack_658) + auVar293._24_4_ * fVar337;
    auVar172._28_4_ = fVar347 + 1.0 + fVar210;
    auVar199._0_4_ =
         fVar101 * fVar308 + auVar293._0_4_ * (auVar16._0_4_ * auVar293._0_4_ + fVar101 * fVar103);
    auVar199._4_4_ =
         fVar178 * fVar316 + auVar293._4_4_ * (auVar16._4_4_ * auVar293._4_4_ + fVar178 * fVar176);
    auVar199._8_4_ =
         fVar206 * fVar317 + auVar293._8_4_ * (auVar16._8_4_ * auVar293._8_4_ + fVar206 * fVar182);
    auVar199._12_4_ =
         fVar294 * fVar318 +
         auVar293._12_4_ * (auVar16._12_4_ * auVar293._12_4_ + fVar294 * fVar209);
    auVar199._16_4_ =
         fVar204 * fVar319 + auVar293._16_4_ * (auVar16._0_4_ * auVar293._16_4_ + fVar204 * fVar103)
    ;
    auVar199._20_4_ =
         fVar208 * fVar320 + auVar293._20_4_ * (auVar16._4_4_ * auVar293._20_4_ + fVar208 * fVar176)
    ;
    auVar199._24_4_ =
         fVar211 * fVar321 + auVar293._24_4_ * (auVar16._8_4_ * auVar293._24_4_ + fVar211 * fVar182)
    ;
    auVar199._28_4_ = fVar210 + fVar149;
    auVar307._0_4_ =
         fVar101 * fVar322 + auVar293._0_4_ * (auVar77._0_4_ * auVar293._0_4_ + fVar101 * fVar150);
    auVar307._4_4_ =
         fVar178 * fVar330 + auVar293._4_4_ * (auVar77._4_4_ * auVar293._4_4_ + fVar178 * fVar180);
    auVar307._8_4_ =
         fVar206 * fVar331 + auVar293._8_4_ * (auVar77._8_4_ * auVar293._8_4_ + fVar206 * fVar202);
    auVar307._12_4_ =
         fVar294 * fVar332 +
         auVar293._12_4_ * (auVar77._12_4_ * auVar293._12_4_ + fVar294 * fVar210);
    auVar307._16_4_ =
         fVar204 * fVar333 + auVar293._16_4_ * (auVar77._0_4_ * auVar293._16_4_ + fVar204 * fVar150)
    ;
    auVar307._20_4_ =
         fVar208 * fVar335 + auVar293._20_4_ * (auVar77._4_4_ * auVar293._20_4_ + fVar208 * fVar180)
    ;
    auVar307._24_4_ =
         fVar211 * fVar337 + auVar293._24_4_ * (auVar77._8_4_ * auVar293._24_4_ + fVar211 * fVar202)
    ;
    auVar307._28_4_ = fVar149 + fVar210 + 0.0;
    local_1c0._0_4_ = fVar101 * auVar97._0_4_ + auVar293._0_4_ * auVar199._0_4_;
    local_1c0._4_4_ = fVar178 * auVar97._4_4_ + auVar293._4_4_ * auVar199._4_4_;
    local_1c0._8_4_ = fVar206 * auVar97._8_4_ + auVar293._8_4_ * auVar199._8_4_;
    local_1c0._12_4_ = fVar294 * auVar97._12_4_ + auVar293._12_4_ * auVar199._12_4_;
    local_1c0._16_4_ = fVar204 * auVar97._16_4_ + auVar293._16_4_ * auVar199._16_4_;
    local_1c0._20_4_ = fVar208 * auVar97._20_4_ + auVar293._20_4_ * auVar199._20_4_;
    local_1c0._24_4_ = fVar211 * auVar97._24_4_ + auVar293._24_4_ * auVar199._24_4_;
    local_1c0._28_4_ = fVar347 + fVar212 + fVar210 + 0.0;
    local_1e0._0_4_ = fVar101 * auVar172._0_4_ + auVar293._0_4_ * auVar307._0_4_;
    local_1e0._4_4_ = fVar178 * auVar172._4_4_ + auVar293._4_4_ * auVar307._4_4_;
    local_1e0._8_4_ = fVar206 * auVar172._8_4_ + auVar293._8_4_ * auVar307._8_4_;
    local_1e0._12_4_ = fVar294 * auVar172._12_4_ + auVar293._12_4_ * auVar307._12_4_;
    local_1e0._16_4_ = fVar204 * auVar172._16_4_ + auVar293._16_4_ * auVar307._16_4_;
    local_1e0._20_4_ = fVar208 * auVar172._20_4_ + auVar293._20_4_ * auVar307._20_4_;
    local_1e0._24_4_ = fVar211 * auVar172._24_4_ + auVar293._24_4_ * auVar307._24_4_;
    local_1e0._28_4_ = fVar347 + fVar212 + fVar149;
    auVar20 = vsubps_avx(auVar199,auVar97);
    auVar95 = vsubps_avx(auVar307,auVar172);
    local_640 = auVar118._0_4_;
    fStack_63c = auVar118._4_4_;
    fStack_638 = auVar118._8_4_;
    fStack_634 = auVar118._12_4_;
    local_220 = local_640 * auVar20._0_4_ * 3.0;
    fStack_21c = fStack_63c * auVar20._4_4_ * 3.0;
    auVar21._4_4_ = fStack_21c;
    auVar21._0_4_ = local_220;
    fStack_218 = fStack_638 * auVar20._8_4_ * 3.0;
    auVar21._8_4_ = fStack_218;
    fStack_214 = fStack_634 * auVar20._12_4_ * 3.0;
    auVar21._12_4_ = fStack_214;
    fStack_210 = local_640 * auVar20._16_4_ * 3.0;
    auVar21._16_4_ = fStack_210;
    fStack_20c = fStack_63c * auVar20._20_4_ * 3.0;
    auVar21._20_4_ = fStack_20c;
    fStack_208 = fStack_638 * auVar20._24_4_ * 3.0;
    auVar21._24_4_ = fStack_208;
    auVar21._28_4_ = auVar20._28_4_;
    fVar316 = local_640 * auVar95._0_4_ * 3.0;
    fVar205 = fStack_63c * auVar95._4_4_ * 3.0;
    auVar22._4_4_ = fVar205;
    auVar22._0_4_ = fVar316;
    fVar317 = fStack_638 * auVar95._8_4_ * 3.0;
    auVar22._8_4_ = fVar317;
    fVar212 = fStack_634 * auVar95._12_4_ * 3.0;
    auVar22._12_4_ = fVar212;
    fVar318 = local_640 * auVar95._16_4_ * 3.0;
    auVar22._16_4_ = fVar318;
    fVar319 = fStack_63c * auVar95._20_4_ * 3.0;
    auVar22._20_4_ = fVar319;
    fVar320 = fStack_638 * auVar95._24_4_ * 3.0;
    auVar22._24_4_ = fVar320;
    auVar22._28_4_ = auVar199._28_4_;
    auVar21 = vsubps_avx(local_1c0,auVar21);
    auVar95 = vperm2f128_avx(auVar21,auVar21,1);
    auVar95 = vshufps_avx(auVar95,auVar21,0x30);
    auVar95 = vshufps_avx(auVar21,auVar95,0x29);
    auVar22 = vsubps_avx(local_1e0,auVar22);
    auVar21 = vperm2f128_avx(auVar22,auVar22,1);
    auVar21 = vshufps_avx(auVar21,auVar22,0x30);
    auVar96 = vshufps_avx(auVar22,auVar21,0x29);
    fVar349 = auVar117._0_4_;
    fVar355 = auVar117._4_4_;
    fVar356 = auVar117._8_4_;
    fVar103 = auVar168._0_4_;
    fVar180 = auVar168._4_4_;
    fVar209 = auVar168._8_4_;
    fVar295 = auVar168._12_4_;
    fVar348 = auVar169._12_4_;
    auVar118 = vshufps_avx(auVar254,auVar254,0xaa);
    fVar150 = auVar118._0_4_;
    fVar182 = auVar118._4_4_;
    fVar210 = auVar118._8_4_;
    fVar308 = auVar118._12_4_;
    fVar332 = auVar293._0_4_ * fVar150 + fVar349 * fVar101;
    fVar333 = auVar293._4_4_ * fVar182 + fVar355 * fVar178;
    fVar335 = auVar293._8_4_ * fVar210 + fVar356 * fVar206;
    fVar337 = auVar293._12_4_ * fVar308 + auVar117._12_4_ * fVar294;
    fVar334 = auVar293._16_4_ * fVar150 + fVar349 * fVar204;
    fVar336 = auVar293._20_4_ * fVar182 + fVar355 * fVar208;
    fVar338 = auVar293._24_4_ * fVar210 + fVar356 * fVar211;
    fVar339 = fVar348 + fVar347 + fVar339;
    auVar118 = vshufps_avx(auVar254,auVar254,0xff);
    fVar176 = auVar118._0_4_;
    fVar202 = auVar118._4_4_;
    fVar149 = auVar118._8_4_;
    fVar184 = auVar118._12_4_;
    fVar321 = auVar293._0_4_ * fVar176 + fVar101 * fVar103;
    fVar242 = auVar293._4_4_ * fVar202 + fVar178 * fVar180;
    fVar322 = auVar293._8_4_ * fVar149 + fVar206 * fVar209;
    fVar243 = auVar293._12_4_ * fVar184 + fVar294 * fVar295;
    fVar330 = auVar293._16_4_ * fVar176 + fVar204 * fVar103;
    fVar244 = auVar293._20_4_ * fVar202 + fVar208 * fVar180;
    fVar331 = auVar293._24_4_ * fVar149 + fVar211 * fVar209;
    auVar118 = vshufps_avx(auVar161,auVar161,0xaa);
    auVar225 = vshufps_avx(auVar161,auVar161,0xff);
    fVar347 = auVar225._12_4_;
    auVar98._0_4_ =
         auVar293._0_4_ * fVar332 + fVar101 * (fVar349 * auVar293._0_4_ + auVar190._0_4_ * fVar101);
    auVar98._4_4_ =
         auVar293._4_4_ * fVar333 + fVar178 * (fVar355 * auVar293._4_4_ + auVar190._4_4_ * fVar178);
    auVar98._8_4_ =
         auVar293._8_4_ * fVar335 + fVar206 * (fVar356 * auVar293._8_4_ + auVar190._8_4_ * fVar206);
    auVar98._12_4_ =
         auVar293._12_4_ * fVar337 +
         fVar294 * (auVar117._12_4_ * auVar293._12_4_ + auVar190._12_4_ * fVar294);
    auVar98._16_4_ =
         auVar293._16_4_ * fVar334 +
         fVar204 * (fVar349 * auVar293._16_4_ + auVar190._0_4_ * fVar204);
    auVar98._20_4_ =
         auVar293._20_4_ * fVar336 +
         fVar208 * (fVar355 * auVar293._20_4_ + auVar190._4_4_ * fVar208);
    auVar98._24_4_ =
         auVar293._24_4_ * fVar338 +
         fVar211 * (fVar356 * auVar293._24_4_ + auVar190._8_4_ * fVar211);
    auVar98._28_4_ = fVar347 + auVar22._28_4_ + auVar21._28_4_;
    auVar346._0_4_ =
         auVar293._0_4_ * fVar321 + fVar101 * (auVar293._0_4_ * fVar103 + auVar169._0_4_ * fVar101);
    auVar346._4_4_ =
         auVar293._4_4_ * fVar242 + fVar178 * (auVar293._4_4_ * fVar180 + auVar169._4_4_ * fVar178);
    auVar346._8_4_ =
         auVar293._8_4_ * fVar322 + fVar206 * (auVar293._8_4_ * fVar209 + auVar169._8_4_ * fVar206);
    auVar346._12_4_ =
         auVar293._12_4_ * fVar243 + fVar294 * (auVar293._12_4_ * fVar295 + fVar348 * fVar294);
    auVar346._16_4_ =
         auVar293._16_4_ * fVar330 +
         fVar204 * (auVar293._16_4_ * fVar103 + auVar169._0_4_ * fVar204);
    auVar346._20_4_ =
         auVar293._20_4_ * fVar244 +
         fVar208 * (auVar293._20_4_ * fVar180 + auVar169._4_4_ * fVar208);
    auVar346._24_4_ =
         auVar293._24_4_ * fVar331 +
         fVar211 * (auVar293._24_4_ * fVar209 + auVar169._8_4_ * fVar211);
    auVar346._28_4_ = fVar347 + auVar21._28_4_ + auVar199._28_4_;
    auVar21 = vperm2f128_avx(local_1c0,local_1c0,1);
    auVar21 = vshufps_avx(auVar21,local_1c0,0x30);
    auVar97 = vshufps_avx(local_1c0,auVar21,0x29);
    auVar200._0_4_ =
         fVar101 * fVar332 + auVar293._0_4_ * (auVar118._0_4_ * auVar293._0_4_ + fVar101 * fVar150);
    auVar200._4_4_ =
         fVar178 * fVar333 + auVar293._4_4_ * (auVar118._4_4_ * auVar293._4_4_ + fVar178 * fVar182);
    auVar200._8_4_ =
         fVar206 * fVar335 + auVar293._8_4_ * (auVar118._8_4_ * auVar293._8_4_ + fVar206 * fVar210);
    auVar200._12_4_ =
         fVar294 * fVar337 +
         auVar293._12_4_ * (auVar118._12_4_ * auVar293._12_4_ + fVar294 * fVar308);
    auVar200._16_4_ =
         fVar204 * fVar334 +
         auVar293._16_4_ * (auVar118._0_4_ * auVar293._16_4_ + fVar204 * fVar150);
    auVar200._20_4_ =
         fVar208 * fVar336 +
         auVar293._20_4_ * (auVar118._4_4_ * auVar293._20_4_ + fVar208 * fVar182);
    auVar200._24_4_ =
         fVar211 * fVar338 +
         auVar293._24_4_ * (auVar118._8_4_ * auVar293._24_4_ + fVar211 * fVar210);
    auVar200._28_4_ = fVar339 + auVar118._12_4_ + fVar308;
    auVar241._0_4_ =
         fVar101 * fVar321 + auVar293._0_4_ * (auVar225._0_4_ * auVar293._0_4_ + fVar101 * fVar176);
    auVar241._4_4_ =
         fVar178 * fVar242 + auVar293._4_4_ * (auVar225._4_4_ * auVar293._4_4_ + fVar178 * fVar202);
    auVar241._8_4_ =
         fVar206 * fVar322 + auVar293._8_4_ * (auVar225._8_4_ * auVar293._8_4_ + fVar206 * fVar149);
    auVar241._12_4_ =
         fVar294 * fVar243 + auVar293._12_4_ * (fVar347 * auVar293._12_4_ + fVar294 * fVar184);
    auVar241._16_4_ =
         fVar204 * fVar330 +
         auVar293._16_4_ * (auVar225._0_4_ * auVar293._16_4_ + fVar204 * fVar176);
    auVar241._20_4_ =
         fVar208 * fVar244 +
         auVar293._20_4_ * (auVar225._4_4_ * auVar293._20_4_ + fVar208 * fVar202);
    auVar241._24_4_ =
         fVar211 * fVar331 +
         auVar293._24_4_ * (auVar225._8_4_ * auVar293._24_4_ + fVar211 * fVar149);
    auVar241._28_4_ = fVar348 + fVar295 + fVar347 + fVar184;
    auVar258._0_4_ = fVar101 * auVar98._0_4_ + auVar293._0_4_ * auVar200._0_4_;
    auVar258._4_4_ = fVar178 * auVar98._4_4_ + auVar293._4_4_ * auVar200._4_4_;
    auVar258._8_4_ = fVar206 * auVar98._8_4_ + auVar293._8_4_ * auVar200._8_4_;
    auVar258._12_4_ = fVar294 * auVar98._12_4_ + auVar293._12_4_ * auVar200._12_4_;
    auVar258._16_4_ = fVar204 * auVar98._16_4_ + auVar293._16_4_ * auVar200._16_4_;
    auVar258._20_4_ = fVar208 * auVar98._20_4_ + auVar293._20_4_ * auVar200._20_4_;
    auVar258._24_4_ = fVar211 * auVar98._24_4_ + auVar293._24_4_ * auVar200._24_4_;
    auVar258._28_4_ = fVar339 + fVar347 + fVar184;
    auVar279._0_4_ = fVar101 * auVar346._0_4_ + auVar293._0_4_ * auVar241._0_4_;
    auVar279._4_4_ = fVar178 * auVar346._4_4_ + auVar293._4_4_ * auVar241._4_4_;
    auVar279._8_4_ = fVar206 * auVar346._8_4_ + auVar293._8_4_ * auVar241._8_4_;
    auVar279._12_4_ = fVar294 * auVar346._12_4_ + auVar293._12_4_ * auVar241._12_4_;
    auVar279._16_4_ = fVar204 * auVar346._16_4_ + auVar293._16_4_ * auVar241._16_4_;
    auVar279._20_4_ = fVar208 * auVar346._20_4_ + auVar293._20_4_ * auVar241._20_4_;
    auVar279._24_4_ = fVar211 * auVar346._24_4_ + auVar293._24_4_ * auVar241._24_4_;
    auVar279._28_4_ = auVar19._28_4_ + auVar293._28_4_;
    auVar21 = vsubps_avx(auVar200,auVar98);
    auVar19 = vsubps_avx(auVar241,auVar346);
    local_240 = local_640 * auVar21._0_4_ * 3.0;
    fStack_23c = fStack_63c * auVar21._4_4_ * 3.0;
    auVar17._4_4_ = fStack_23c;
    auVar17._0_4_ = local_240;
    fStack_238 = fStack_638 * auVar21._8_4_ * 3.0;
    auVar17._8_4_ = fStack_238;
    fStack_234 = fStack_634 * auVar21._12_4_ * 3.0;
    auVar17._12_4_ = fStack_234;
    fStack_230 = local_640 * auVar21._16_4_ * 3.0;
    auVar17._16_4_ = fStack_230;
    fStack_22c = fStack_63c * auVar21._20_4_ * 3.0;
    auVar17._20_4_ = fStack_22c;
    fStack_228 = fStack_638 * auVar21._24_4_ * 3.0;
    auVar17._24_4_ = fStack_228;
    auVar17._28_4_ = auVar241._28_4_;
    local_260 = local_640 * auVar19._0_4_ * 3.0;
    fStack_25c = fStack_63c * auVar19._4_4_ * 3.0;
    auVar18._4_4_ = fStack_25c;
    auVar18._0_4_ = local_260;
    fStack_258 = fStack_638 * auVar19._8_4_ * 3.0;
    auVar18._8_4_ = fStack_258;
    fStack_254 = fStack_634 * auVar19._12_4_ * 3.0;
    auVar18._12_4_ = fStack_254;
    local_640 = local_640 * auVar19._16_4_ * 3.0;
    auVar18._16_4_ = local_640;
    fStack_63c = fStack_63c * auVar19._20_4_ * 3.0;
    auVar18._20_4_ = fStack_63c;
    fStack_638 = fStack_638 * auVar19._24_4_ * 3.0;
    auVar18._24_4_ = fStack_638;
    auVar18._28_4_ = fStack_634;
    auVar21 = vperm2f128_avx(auVar258,auVar258,1);
    auVar21 = vshufps_avx(auVar21,auVar258,0x30);
    auVar98 = vshufps_avx(auVar258,auVar21,0x29);
    auVar19 = vsubps_avx(auVar258,auVar17);
    auVar21 = vperm2f128_avx(auVar19,auVar19,1);
    auVar21 = vshufps_avx(auVar21,auVar19,0x30);
    auVar17 = vshufps_avx(auVar19,auVar21,0x29);
    auVar19 = vsubps_avx(auVar279,auVar18);
    auVar21 = vperm2f128_avx(auVar19,auVar19,1);
    auVar21 = vshufps_avx(auVar21,auVar19,0x30);
    auVar18 = vshufps_avx(auVar19,auVar21,0x29);
    auVar22 = vsubps_avx(auVar258,local_1c0);
    auVar23 = vsubps_avx(auVar98,auVar97);
    fVar101 = auVar23._0_4_ + auVar22._0_4_;
    fVar103 = auVar23._4_4_ + auVar22._4_4_;
    fVar150 = auVar23._8_4_ + auVar22._8_4_;
    fVar176 = auVar23._12_4_ + auVar22._12_4_;
    fVar178 = auVar23._16_4_ + auVar22._16_4_;
    fVar180 = auVar23._20_4_ + auVar22._20_4_;
    fVar182 = auVar23._24_4_ + auVar22._24_4_;
    auVar19 = vperm2f128_avx(local_1e0,local_1e0,1);
    auVar19 = vshufps_avx(auVar19,local_1e0,0x30);
    local_200 = vshufps_avx(local_1e0,auVar19,0x29);
    auVar19 = vperm2f128_avx(auVar279,auVar279,1);
    auVar19 = vshufps_avx(auVar19,auVar279,0x30);
    auVar172 = vshufps_avx(auVar279,auVar19,0x29);
    auVar19 = vsubps_avx(auVar279,local_1e0);
    auVar200 = vsubps_avx(auVar172,local_200);
    fVar202 = auVar19._0_4_ + auVar200._0_4_;
    fVar206 = auVar19._4_4_ + auVar200._4_4_;
    fVar209 = auVar19._8_4_ + auVar200._8_4_;
    fVar210 = auVar19._12_4_ + auVar200._12_4_;
    fVar149 = auVar19._16_4_ + auVar200._16_4_;
    fVar294 = auVar19._20_4_ + auVar200._20_4_;
    fVar295 = auVar19._24_4_ + auVar200._24_4_;
    fVar308 = auVar19._28_4_;
    auVar19._4_4_ = local_1e0._4_4_ * fVar103;
    auVar19._0_4_ = local_1e0._0_4_ * fVar101;
    auVar19._8_4_ = local_1e0._8_4_ * fVar150;
    auVar19._12_4_ = local_1e0._12_4_ * fVar176;
    auVar19._16_4_ = local_1e0._16_4_ * fVar178;
    auVar19._20_4_ = local_1e0._20_4_ * fVar180;
    auVar19._24_4_ = local_1e0._24_4_ * fVar182;
    auVar19._28_4_ = fVar308;
    auVar24._4_4_ = fVar206 * local_1c0._4_4_;
    auVar24._0_4_ = fVar202 * local_1c0._0_4_;
    auVar24._8_4_ = fVar209 * local_1c0._8_4_;
    auVar24._12_4_ = fVar210 * local_1c0._12_4_;
    auVar24._16_4_ = fVar149 * local_1c0._16_4_;
    auVar24._20_4_ = fVar294 * local_1c0._20_4_;
    auVar24._24_4_ = fVar295 * local_1c0._24_4_;
    auVar24._28_4_ = auVar21._28_4_;
    auVar19 = vsubps_avx(auVar19,auVar24);
    local_220 = local_1c0._0_4_ + local_220;
    fStack_21c = local_1c0._4_4_ + fStack_21c;
    fStack_218 = local_1c0._8_4_ + fStack_218;
    fStack_214 = local_1c0._12_4_ + fStack_214;
    fStack_210 = local_1c0._16_4_ + fStack_210;
    fStack_20c = local_1c0._20_4_ + fStack_20c;
    fStack_208 = local_1c0._24_4_ + fStack_208;
    fStack_204 = local_1c0._28_4_ + auVar20._28_4_;
    fVar316 = local_1e0._0_4_ + fVar316;
    fVar205 = local_1e0._4_4_ + fVar205;
    fVar317 = local_1e0._8_4_ + fVar317;
    fVar212 = local_1e0._12_4_ + fVar212;
    fVar318 = local_1e0._16_4_ + fVar318;
    fVar319 = local_1e0._20_4_ + fVar319;
    fVar320 = local_1e0._24_4_ + fVar320;
    auVar20._4_4_ = fVar205 * fVar103;
    auVar20._0_4_ = fVar316 * fVar101;
    auVar20._8_4_ = fVar317 * fVar150;
    auVar20._12_4_ = fVar212 * fVar176;
    auVar20._16_4_ = fVar318 * fVar178;
    auVar20._20_4_ = fVar319 * fVar180;
    auVar20._24_4_ = fVar320 * fVar182;
    auVar20._28_4_ = fVar308;
    auVar25._4_4_ = fVar206 * fStack_21c;
    auVar25._0_4_ = fVar202 * local_220;
    auVar25._8_4_ = fVar209 * fStack_218;
    auVar25._12_4_ = fVar210 * fStack_214;
    auVar25._16_4_ = fVar149 * fStack_210;
    auVar25._20_4_ = fVar294 * fStack_20c;
    auVar25._24_4_ = fVar295 * fStack_208;
    auVar25._28_4_ = fStack_204;
    auVar20 = vsubps_avx(auVar20,auVar25);
    auVar26._4_4_ = auVar96._4_4_ * fVar103;
    auVar26._0_4_ = auVar96._0_4_ * fVar101;
    auVar26._8_4_ = auVar96._8_4_ * fVar150;
    auVar26._12_4_ = auVar96._12_4_ * fVar176;
    auVar26._16_4_ = auVar96._16_4_ * fVar178;
    auVar26._20_4_ = auVar96._20_4_ * fVar180;
    auVar26._24_4_ = auVar96._24_4_ * fVar182;
    auVar26._28_4_ = fVar308;
    local_660 = auVar95._0_4_;
    fStack_65c = auVar95._4_4_;
    fStack_658 = auVar95._8_4_;
    fStack_654 = auVar95._12_4_;
    fStack_650 = auVar95._16_4_;
    fStack_64c = auVar95._20_4_;
    fStack_648 = auVar95._24_4_;
    auVar27._4_4_ = fVar206 * fStack_65c;
    auVar27._0_4_ = fVar202 * local_660;
    auVar27._8_4_ = fVar209 * fStack_658;
    auVar27._12_4_ = fVar210 * fStack_654;
    auVar27._16_4_ = fVar149 * fStack_650;
    auVar27._20_4_ = fVar294 * fStack_64c;
    auVar27._24_4_ = fVar295 * fStack_648;
    auVar27._28_4_ = 0x40400000;
    auVar24 = vsubps_avx(auVar26,auVar27);
    auVar28._4_4_ = local_200._4_4_ * fVar103;
    auVar28._0_4_ = local_200._0_4_ * fVar101;
    auVar28._8_4_ = local_200._8_4_ * fVar150;
    auVar28._12_4_ = local_200._12_4_ * fVar176;
    auVar28._16_4_ = local_200._16_4_ * fVar178;
    auVar28._20_4_ = local_200._20_4_ * fVar180;
    auVar28._24_4_ = local_200._24_4_ * fVar182;
    auVar28._28_4_ = fVar308;
    auVar29._4_4_ = auVar97._4_4_ * fVar206;
    auVar29._0_4_ = auVar97._0_4_ * fVar202;
    auVar29._8_4_ = auVar97._8_4_ * fVar209;
    auVar29._12_4_ = auVar97._12_4_ * fVar210;
    auVar29._16_4_ = auVar97._16_4_ * fVar149;
    auVar29._20_4_ = auVar97._20_4_ * fVar294;
    auVar29._24_4_ = auVar97._24_4_ * fVar295;
    auVar29._28_4_ = local_200._28_4_;
    auVar25 = vsubps_avx(auVar28,auVar29);
    auVar30._4_4_ = auVar279._4_4_ * fVar103;
    auVar30._0_4_ = auVar279._0_4_ * fVar101;
    auVar30._8_4_ = auVar279._8_4_ * fVar150;
    auVar30._12_4_ = auVar279._12_4_ * fVar176;
    auVar30._16_4_ = auVar279._16_4_ * fVar178;
    auVar30._20_4_ = auVar279._20_4_ * fVar180;
    auVar30._24_4_ = auVar279._24_4_ * fVar182;
    auVar30._28_4_ = fVar308;
    auVar31._4_4_ = fVar206 * auVar258._4_4_;
    auVar31._0_4_ = fVar202 * auVar258._0_4_;
    auVar31._8_4_ = fVar209 * auVar258._8_4_;
    auVar31._12_4_ = fVar210 * auVar258._12_4_;
    auVar31._16_4_ = fVar149 * auVar258._16_4_;
    auVar31._20_4_ = fVar294 * auVar258._20_4_;
    auVar31._24_4_ = fVar295 * auVar258._24_4_;
    auVar31._28_4_ = auVar96._28_4_;
    auVar26 = vsubps_avx(auVar30,auVar31);
    local_240 = auVar258._0_4_ + local_240;
    fStack_23c = auVar258._4_4_ + fStack_23c;
    fStack_238 = auVar258._8_4_ + fStack_238;
    fStack_234 = auVar258._12_4_ + fStack_234;
    fStack_230 = auVar258._16_4_ + fStack_230;
    fStack_22c = auVar258._20_4_ + fStack_22c;
    fStack_228 = auVar258._24_4_ + fStack_228;
    fStack_224 = auVar258._28_4_ + auVar241._28_4_;
    local_260 = auVar279._0_4_ + local_260;
    fStack_25c = auVar279._4_4_ + fStack_25c;
    fStack_258 = auVar279._8_4_ + fStack_258;
    fStack_254 = auVar279._12_4_ + fStack_254;
    fStack_250 = auVar279._16_4_ + local_640;
    fStack_24c = auVar279._20_4_ + fStack_63c;
    fStack_248 = auVar279._24_4_ + fStack_638;
    fStack_244 = auVar279._28_4_ + fStack_634;
    auVar32._4_4_ = fStack_25c * fVar103;
    auVar32._0_4_ = local_260 * fVar101;
    auVar32._8_4_ = fStack_258 * fVar150;
    auVar32._12_4_ = fStack_254 * fVar176;
    auVar32._16_4_ = fStack_250 * fVar178;
    auVar32._20_4_ = fStack_24c * fVar180;
    auVar32._24_4_ = fStack_248 * fVar182;
    auVar32._28_4_ = auVar279._28_4_ + fStack_634;
    auVar33._4_4_ = fStack_23c * fVar206;
    auVar33._0_4_ = local_240 * fVar202;
    auVar33._8_4_ = fStack_238 * fVar209;
    auVar33._12_4_ = fStack_234 * fVar210;
    auVar33._16_4_ = fStack_230 * fVar149;
    auVar33._20_4_ = fStack_22c * fVar294;
    auVar33._24_4_ = fStack_228 * fVar295;
    auVar33._28_4_ = fStack_224;
    auVar27 = vsubps_avx(auVar32,auVar33);
    auVar34._4_4_ = auVar18._4_4_ * fVar103;
    auVar34._0_4_ = auVar18._0_4_ * fVar101;
    auVar34._8_4_ = auVar18._8_4_ * fVar150;
    auVar34._12_4_ = auVar18._12_4_ * fVar176;
    auVar34._16_4_ = auVar18._16_4_ * fVar178;
    auVar34._20_4_ = auVar18._20_4_ * fVar180;
    auVar34._24_4_ = auVar18._24_4_ * fVar182;
    auVar34._28_4_ = fStack_224;
    auVar35._4_4_ = fVar206 * auVar17._4_4_;
    auVar35._0_4_ = fVar202 * auVar17._0_4_;
    auVar35._8_4_ = fVar209 * auVar17._8_4_;
    auVar35._12_4_ = fVar210 * auVar17._12_4_;
    auVar35._16_4_ = fVar149 * auVar17._16_4_;
    auVar35._20_4_ = fVar294 * auVar17._20_4_;
    auVar35._24_4_ = fVar295 * auVar17._24_4_;
    auVar35._28_4_ = auVar17._28_4_;
    auVar28 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = auVar172._4_4_ * fVar103;
    auVar36._0_4_ = auVar172._0_4_ * fVar101;
    auVar36._8_4_ = auVar172._8_4_ * fVar150;
    auVar36._12_4_ = auVar172._12_4_ * fVar176;
    auVar36._16_4_ = auVar172._16_4_ * fVar178;
    auVar36._20_4_ = auVar172._20_4_ * fVar180;
    auVar36._24_4_ = auVar172._24_4_ * fVar182;
    auVar36._28_4_ = auVar23._28_4_ + auVar22._28_4_;
    auVar23._4_4_ = auVar98._4_4_ * fVar206;
    auVar23._0_4_ = auVar98._0_4_ * fVar202;
    auVar23._8_4_ = auVar98._8_4_ * fVar209;
    auVar23._12_4_ = auVar98._12_4_ * fVar210;
    auVar23._16_4_ = auVar98._16_4_ * fVar149;
    auVar23._20_4_ = auVar98._20_4_ * fVar294;
    auVar23._24_4_ = auVar98._24_4_ * fVar295;
    auVar23._28_4_ = fVar308 + auVar200._28_4_;
    auVar23 = vsubps_avx(auVar36,auVar23);
    auVar21 = vminps_avx(auVar19,auVar20);
    auVar95 = vmaxps_avx(auVar19,auVar20);
    auVar19 = vminps_avx(auVar24,auVar25);
    auVar19 = vminps_avx(auVar21,auVar19);
    auVar21 = vmaxps_avx(auVar24,auVar25);
    auVar95 = vmaxps_avx(auVar95,auVar21);
    auVar20 = vminps_avx(auVar26,auVar27);
    auVar21 = vmaxps_avx(auVar26,auVar27);
    auVar22 = vminps_avx(auVar28,auVar23);
    auVar20 = vminps_avx(auVar20,auVar22);
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar28,auVar23);
    auVar21 = vmaxps_avx(auVar21,auVar19);
    auVar21 = vmaxps_avx(auVar95,auVar21);
    auVar95 = vcmpps_avx(auVar20,local_280,2);
    auVar21 = vcmpps_avx(auVar21,local_2a0,5);
    auVar95 = vandps_avx(auVar21,auVar95);
    auVar21 = local_320 & auVar95;
    uVar67 = 0;
    if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0x7f,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar21 >> 0xbf,0) != '\0') ||
        (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar21[0x1f] < '\0')
    {
      auVar21 = vsubps_avx(auVar97,local_1c0);
      auVar19 = vsubps_avx(auVar98,auVar258);
      fVar103 = auVar21._0_4_ + auVar19._0_4_;
      fVar150 = auVar21._4_4_ + auVar19._4_4_;
      fVar176 = auVar21._8_4_ + auVar19._8_4_;
      fVar178 = auVar21._12_4_ + auVar19._12_4_;
      fVar180 = auVar21._16_4_ + auVar19._16_4_;
      fVar182 = auVar21._20_4_ + auVar19._20_4_;
      fVar202 = auVar21._24_4_ + auVar19._24_4_;
      auVar20 = vsubps_avx(local_200,local_1e0);
      auVar22 = vsubps_avx(auVar172,auVar279);
      fVar206 = auVar20._0_4_ + auVar22._0_4_;
      fVar209 = auVar20._4_4_ + auVar22._4_4_;
      fVar210 = auVar20._8_4_ + auVar22._8_4_;
      fVar149 = auVar20._12_4_ + auVar22._12_4_;
      fVar294 = auVar20._16_4_ + auVar22._16_4_;
      fVar295 = auVar20._20_4_ + auVar22._20_4_;
      fVar308 = auVar20._24_4_ + auVar22._24_4_;
      fVar101 = auVar22._28_4_;
      auVar37._4_4_ = local_1e0._4_4_ * fVar150;
      auVar37._0_4_ = local_1e0._0_4_ * fVar103;
      auVar37._8_4_ = local_1e0._8_4_ * fVar176;
      auVar37._12_4_ = local_1e0._12_4_ * fVar178;
      auVar37._16_4_ = local_1e0._16_4_ * fVar180;
      auVar37._20_4_ = local_1e0._20_4_ * fVar182;
      auVar37._24_4_ = local_1e0._24_4_ * fVar202;
      auVar37._28_4_ = local_1e0._28_4_;
      auVar38._4_4_ = local_1c0._4_4_ * fVar209;
      auVar38._0_4_ = local_1c0._0_4_ * fVar206;
      auVar38._8_4_ = local_1c0._8_4_ * fVar210;
      auVar38._12_4_ = local_1c0._12_4_ * fVar149;
      auVar38._16_4_ = local_1c0._16_4_ * fVar294;
      auVar38._20_4_ = local_1c0._20_4_ * fVar295;
      auVar38._24_4_ = local_1c0._24_4_ * fVar308;
      auVar38._28_4_ = local_1c0._28_4_;
      auVar22 = vsubps_avx(auVar37,auVar38);
      auVar39._4_4_ = fVar205 * fVar150;
      auVar39._0_4_ = fVar316 * fVar103;
      auVar39._8_4_ = fVar317 * fVar176;
      auVar39._12_4_ = fVar212 * fVar178;
      auVar39._16_4_ = fVar318 * fVar180;
      auVar39._20_4_ = fVar319 * fVar182;
      auVar39._24_4_ = fVar320 * fVar202;
      auVar39._28_4_ = local_1e0._28_4_;
      auVar40._4_4_ = fVar209 * fStack_21c;
      auVar40._0_4_ = fVar206 * local_220;
      auVar40._8_4_ = fVar210 * fStack_218;
      auVar40._12_4_ = fVar149 * fStack_214;
      auVar40._16_4_ = fVar294 * fStack_210;
      auVar40._20_4_ = fVar295 * fStack_20c;
      auVar40._24_4_ = fVar308 * fStack_208;
      auVar40._28_4_ = fVar101;
      auVar23 = vsubps_avx(auVar39,auVar40);
      auVar41._4_4_ = fVar150 * auVar96._4_4_;
      auVar41._0_4_ = fVar103 * auVar96._0_4_;
      auVar41._8_4_ = fVar176 * auVar96._8_4_;
      auVar41._12_4_ = fVar178 * auVar96._12_4_;
      auVar41._16_4_ = fVar180 * auVar96._16_4_;
      auVar41._20_4_ = fVar182 * auVar96._20_4_;
      auVar41._24_4_ = fVar202 * auVar96._24_4_;
      auVar41._28_4_ = fVar101;
      auVar42._4_4_ = fVar209 * fStack_65c;
      auVar42._0_4_ = fVar206 * local_660;
      auVar42._8_4_ = fVar210 * fStack_658;
      auVar42._12_4_ = fVar149 * fStack_654;
      auVar42._16_4_ = fVar294 * fStack_650;
      auVar42._20_4_ = fVar295 * fStack_64c;
      auVar42._24_4_ = fVar308 * fStack_648;
      auVar42._28_4_ = local_1e0._28_4_ + auVar199._28_4_;
      auVar96 = vsubps_avx(auVar41,auVar42);
      auVar43._4_4_ = local_200._4_4_ * fVar150;
      auVar43._0_4_ = local_200._0_4_ * fVar103;
      auVar43._8_4_ = local_200._8_4_ * fVar176;
      auVar43._12_4_ = local_200._12_4_ * fVar178;
      auVar43._16_4_ = local_200._16_4_ * fVar180;
      auVar43._20_4_ = local_200._20_4_ * fVar182;
      auVar43._24_4_ = local_200._24_4_ * fVar202;
      auVar43._28_4_ = local_1e0._28_4_ + auVar199._28_4_;
      auVar44._4_4_ = auVar97._4_4_ * fVar209;
      auVar44._0_4_ = auVar97._0_4_ * fVar206;
      auVar44._8_4_ = auVar97._8_4_ * fVar210;
      auVar44._12_4_ = auVar97._12_4_ * fVar149;
      auVar44._16_4_ = auVar97._16_4_ * fVar294;
      auVar44._20_4_ = auVar97._20_4_ * fVar295;
      uVar4 = auVar97._28_4_;
      auVar44._24_4_ = auVar97._24_4_ * fVar308;
      auVar44._28_4_ = uVar4;
      auVar97 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = auVar279._4_4_ * fVar150;
      auVar45._0_4_ = auVar279._0_4_ * fVar103;
      auVar45._8_4_ = auVar279._8_4_ * fVar176;
      auVar45._12_4_ = auVar279._12_4_ * fVar178;
      auVar45._16_4_ = auVar279._16_4_ * fVar180;
      auVar45._20_4_ = auVar279._20_4_ * fVar182;
      auVar45._24_4_ = auVar279._24_4_ * fVar202;
      auVar45._28_4_ = auVar279._28_4_;
      auVar46._4_4_ = auVar258._4_4_ * fVar209;
      auVar46._0_4_ = auVar258._0_4_ * fVar206;
      auVar46._8_4_ = auVar258._8_4_ * fVar210;
      auVar46._12_4_ = auVar258._12_4_ * fVar149;
      auVar46._16_4_ = auVar258._16_4_ * fVar294;
      auVar46._20_4_ = auVar258._20_4_ * fVar295;
      auVar46._24_4_ = auVar258._24_4_ * fVar308;
      auVar46._28_4_ = auVar258._28_4_;
      auVar200 = vsubps_avx(auVar45,auVar46);
      auVar47._4_4_ = fVar150 * fStack_25c;
      auVar47._0_4_ = fVar103 * local_260;
      auVar47._8_4_ = fVar176 * fStack_258;
      auVar47._12_4_ = fVar178 * fStack_254;
      auVar47._16_4_ = fVar180 * fStack_250;
      auVar47._20_4_ = fVar182 * fStack_24c;
      auVar47._24_4_ = fVar202 * fStack_248;
      auVar47._28_4_ = auVar279._28_4_;
      auVar48._4_4_ = fVar209 * fStack_23c;
      auVar48._0_4_ = fVar206 * local_240;
      auVar48._8_4_ = fVar210 * fStack_238;
      auVar48._12_4_ = fVar149 * fStack_234;
      auVar48._16_4_ = fVar294 * fStack_230;
      auVar48._20_4_ = fVar295 * fStack_22c;
      auVar48._24_4_ = fVar308 * fStack_228;
      auVar48._28_4_ = uVar4;
      auVar24 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar150 * auVar18._4_4_;
      auVar49._0_4_ = fVar103 * auVar18._0_4_;
      auVar49._8_4_ = fVar176 * auVar18._8_4_;
      auVar49._12_4_ = fVar178 * auVar18._12_4_;
      auVar49._16_4_ = fVar180 * auVar18._16_4_;
      auVar49._20_4_ = fVar182 * auVar18._20_4_;
      auVar49._24_4_ = fVar202 * auVar18._24_4_;
      auVar49._28_4_ = uVar4;
      auVar50._4_4_ = fVar209 * auVar17._4_4_;
      auVar50._0_4_ = fVar206 * auVar17._0_4_;
      auVar50._8_4_ = fVar210 * auVar17._8_4_;
      auVar50._12_4_ = fVar149 * auVar17._12_4_;
      auVar50._16_4_ = fVar294 * auVar17._16_4_;
      auVar50._20_4_ = fVar295 * auVar17._20_4_;
      auVar50._24_4_ = fVar308 * auVar17._24_4_;
      auVar50._28_4_ = local_200._28_4_;
      auVar17 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = auVar172._4_4_ * fVar150;
      auVar51._0_4_ = auVar172._0_4_ * fVar103;
      auVar51._8_4_ = auVar172._8_4_ * fVar176;
      auVar51._12_4_ = auVar172._12_4_ * fVar178;
      auVar51._16_4_ = auVar172._16_4_ * fVar180;
      auVar51._20_4_ = auVar172._20_4_ * fVar182;
      auVar51._24_4_ = auVar172._24_4_ * fVar202;
      auVar51._28_4_ = auVar21._28_4_ + auVar19._28_4_;
      auVar52._4_4_ = auVar98._4_4_ * fVar209;
      auVar52._0_4_ = auVar98._0_4_ * fVar206;
      auVar52._8_4_ = auVar98._8_4_ * fVar210;
      auVar52._12_4_ = auVar98._12_4_ * fVar149;
      auVar52._16_4_ = auVar98._16_4_ * fVar294;
      auVar52._20_4_ = auVar98._20_4_ * fVar295;
      auVar52._24_4_ = auVar98._24_4_ * fVar308;
      auVar52._28_4_ = auVar20._28_4_ + fVar101;
      auVar98 = vsubps_avx(auVar51,auVar52);
      auVar19 = vminps_avx(auVar22,auVar23);
      auVar21 = vmaxps_avx(auVar22,auVar23);
      auVar20 = vminps_avx(auVar96,auVar97);
      auVar20 = vminps_avx(auVar19,auVar20);
      auVar19 = vmaxps_avx(auVar96,auVar97);
      auVar21 = vmaxps_avx(auVar21,auVar19);
      auVar22 = vminps_avx(auVar200,auVar24);
      auVar19 = vmaxps_avx(auVar200,auVar24);
      auVar96 = vminps_avx(auVar17,auVar98);
      auVar22 = vminps_avx(auVar22,auVar96);
      auVar22 = vminps_avx(auVar20,auVar22);
      auVar20 = vmaxps_avx(auVar17,auVar98);
      auVar19 = vmaxps_avx(auVar19,auVar20);
      auVar19 = vmaxps_avx(auVar21,auVar19);
      auVar21 = vcmpps_avx(auVar22,local_280,2);
      auVar19 = vcmpps_avx(auVar19,local_2a0,5);
      auVar21 = vandps_avx(auVar19,auVar21);
      auVar95 = vandps_avx(auVar95,local_320);
      auVar19 = auVar95 & auVar21;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0x7f,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0xbf,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar19[0x1f] < '\0') {
        auVar95 = vandps_avx(auVar21,auVar95);
        uVar67 = vmovmskps_avx(auVar95);
      }
    }
    if (uVar67 != 0) {
      auStack_450[uVar69] = uVar67;
      uVar5 = vmovlps_avx(local_3e0);
      *(undefined8 *)(afStack_300 + uVar69 * 2) = uVar5;
      uVar6 = vmovlps_avx(_local_6f0);
      auStack_1a0[uVar69] = uVar6;
      uVar69 = (ulong)((int)uVar69 + 1);
    }
    auVar363 = ZEXT464(0) << 0x20;
    do {
      if ((int)uVar69 == 0) {
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar94._4_4_ = uVar4;
        auVar94._0_4_ = uVar4;
        auVar94._8_4_ = uVar4;
        auVar94._12_4_ = uVar4;
        auVar118 = vcmpps_avx(local_440,auVar94,2);
        uVar74 = vmovmskps_avx(auVar118);
        uVar66 = uVar66 & local_508 & uVar74;
        if (uVar66 == 0) {
          return;
        }
        goto LAB_01092fa7;
      }
      uVar71 = (int)uVar69 - 1;
      uVar73 = (ulong)uVar71;
      uVar67 = auStack_450[uVar73];
      fVar101 = afStack_300[uVar73 * 2];
      fVar103 = afStack_300[uVar73 * 2 + 1];
      register0x00001588 = 0;
      local_6f0 = (undefined1  [8])auStack_1a0[uVar73];
      uVar6 = 0;
      if (uVar67 != 0) {
        for (; (uVar67 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      uVar67 = uVar67 - 1 & uVar67;
      auStack_450[uVar73] = uVar67;
      if (uVar67 == 0) {
        uVar69 = (ulong)uVar71;
      }
      auVar217._8_4_ = 0x3f800000;
      auVar217._0_8_ = &DAT_3f8000003f800000;
      auVar217._12_4_ = 0x3f800000;
      fVar176 = (float)(uVar6 + 1) * 0.14285715;
      fVar150 = (1.0 - (float)uVar6 * 0.14285715) * fVar101 + fVar103 * (float)uVar6 * 0.14285715;
      fVar101 = (1.0 - fVar176) * fVar101 + fVar103 * fVar176;
      fVar103 = fVar101 - fVar150;
      if (0.16666667 <= fVar103) break;
      auVar118 = vshufps_avx(_local_6f0,_local_6f0,0x50);
      auVar190 = vsubps_avx(auVar217,auVar118);
      fVar176 = auVar118._0_4_;
      fVar178 = auVar118._4_4_;
      fVar180 = auVar118._8_4_;
      fVar182 = auVar118._12_4_;
      fVar202 = auVar190._0_4_;
      fVar206 = auVar190._4_4_;
      fVar209 = auVar190._8_4_;
      fVar210 = auVar190._12_4_;
      auVar162._0_4_ = auVar271._0_4_ * fVar176 + fVar202 * (float)local_5d0._0_4_;
      auVar162._4_4_ = auVar271._4_4_ * fVar178 + fVar206 * (float)local_5d0._4_4_;
      auVar162._8_4_ = auVar271._0_4_ * fVar180 + fVar209 * (float)local_5d0._0_4_;
      auVar162._12_4_ = auVar271._4_4_ * fVar182 + fVar210 * (float)local_5d0._4_4_;
      auVar191._0_4_ = auVar283._0_4_ * fVar176 + fVar202 * (float)local_460._0_4_;
      auVar191._4_4_ = auVar283._4_4_ * fVar178 + fVar206 * (float)local_460._4_4_;
      auVar191._8_4_ = auVar283._0_4_ * fVar180 + fVar209 * fStack_458;
      auVar191._12_4_ = auVar283._4_4_ * fVar182 + fVar210 * fStack_454;
      auVar218._0_4_ = auVar302._0_4_ * fVar176 + fVar202 * auVar351._0_4_;
      auVar218._4_4_ = auVar302._4_4_ * fVar178 + fVar206 * auVar351._4_4_;
      auVar218._8_4_ = auVar302._0_4_ * fVar180 + fVar209 * auVar351._0_4_;
      auVar218._12_4_ = auVar302._4_4_ * fVar182 + fVar210 * auVar351._4_4_;
      auVar114._0_4_ = auVar90._0_4_ * fVar176 + auVar253._0_4_ * fVar202;
      auVar114._4_4_ = auVar90._4_4_ * fVar178 + auVar253._4_4_ * fVar206;
      auVar114._8_4_ = auVar90._0_4_ * fVar180 + auVar253._0_4_ * fVar209;
      auVar114._12_4_ = auVar90._4_4_ * fVar182 + auVar253._4_4_ * fVar210;
      auVar146._16_16_ = auVar162;
      auVar146._0_16_ = auVar162;
      auVar173._16_16_ = auVar191;
      auVar173._0_16_ = auVar191;
      auVar201._16_16_ = auVar218;
      auVar201._0_16_ = auVar218;
      auVar95 = vshufps_avx(ZEXT2032(CONCAT416(fVar101,ZEXT416((uint)fVar150))),
                            ZEXT2032(CONCAT416(fVar101,ZEXT416((uint)fVar150))),0);
      auVar21 = vsubps_avx(auVar173,auVar146);
      fVar176 = auVar95._0_4_;
      fVar178 = auVar95._4_4_;
      fVar180 = auVar95._8_4_;
      fVar182 = auVar95._12_4_;
      fVar202 = auVar95._16_4_;
      fVar206 = auVar95._20_4_;
      fVar209 = auVar95._24_4_;
      auVar147._0_4_ = auVar162._0_4_ + auVar21._0_4_ * fVar176;
      auVar147._4_4_ = auVar162._4_4_ + auVar21._4_4_ * fVar178;
      auVar147._8_4_ = auVar162._8_4_ + auVar21._8_4_ * fVar180;
      auVar147._12_4_ = auVar162._12_4_ + auVar21._12_4_ * fVar182;
      auVar147._16_4_ = auVar162._0_4_ + auVar21._16_4_ * fVar202;
      auVar147._20_4_ = auVar162._4_4_ + auVar21._20_4_ * fVar206;
      auVar147._24_4_ = auVar162._8_4_ + auVar21._24_4_ * fVar209;
      auVar147._28_4_ = auVar162._12_4_ + auVar21._28_4_;
      auVar21 = vsubps_avx(auVar201,auVar173);
      auVar174._0_4_ = auVar191._0_4_ + auVar21._0_4_ * fVar176;
      auVar174._4_4_ = auVar191._4_4_ + auVar21._4_4_ * fVar178;
      auVar174._8_4_ = auVar191._8_4_ + auVar21._8_4_ * fVar180;
      auVar174._12_4_ = auVar191._12_4_ + auVar21._12_4_ * fVar182;
      auVar174._16_4_ = auVar191._0_4_ + auVar21._16_4_ * fVar202;
      auVar174._20_4_ = auVar191._4_4_ + auVar21._20_4_ * fVar206;
      auVar174._24_4_ = auVar191._8_4_ + auVar21._24_4_ * fVar209;
      auVar174._28_4_ = auVar191._12_4_ + auVar21._28_4_;
      auVar118 = vsubps_avx(auVar114,auVar218);
      auVar127._0_4_ = auVar218._0_4_ + auVar118._0_4_ * fVar176;
      auVar127._4_4_ = auVar218._4_4_ + auVar118._4_4_ * fVar178;
      auVar127._8_4_ = auVar218._8_4_ + auVar118._8_4_ * fVar180;
      auVar127._12_4_ = auVar218._12_4_ + auVar118._12_4_ * fVar182;
      auVar127._16_4_ = auVar218._0_4_ + auVar118._0_4_ * fVar202;
      auVar127._20_4_ = auVar218._4_4_ + auVar118._4_4_ * fVar206;
      auVar127._24_4_ = auVar218._8_4_ + auVar118._8_4_ * fVar209;
      auVar127._28_4_ = auVar218._12_4_ + auVar118._12_4_;
      auVar21 = vsubps_avx(auVar174,auVar147);
      auVar148._0_4_ = auVar147._0_4_ + fVar176 * auVar21._0_4_;
      auVar148._4_4_ = auVar147._4_4_ + fVar178 * auVar21._4_4_;
      auVar148._8_4_ = auVar147._8_4_ + fVar180 * auVar21._8_4_;
      auVar148._12_4_ = auVar147._12_4_ + fVar182 * auVar21._12_4_;
      auVar148._16_4_ = auVar147._16_4_ + fVar202 * auVar21._16_4_;
      auVar148._20_4_ = auVar147._20_4_ + fVar206 * auVar21._20_4_;
      auVar148._24_4_ = auVar147._24_4_ + fVar209 * auVar21._24_4_;
      auVar148._28_4_ = auVar147._28_4_ + auVar21._28_4_;
      auVar21 = vsubps_avx(auVar127,auVar174);
      auVar128._0_4_ = auVar174._0_4_ + fVar176 * auVar21._0_4_;
      auVar128._4_4_ = auVar174._4_4_ + fVar178 * auVar21._4_4_;
      auVar128._8_4_ = auVar174._8_4_ + fVar180 * auVar21._8_4_;
      auVar128._12_4_ = auVar174._12_4_ + fVar182 * auVar21._12_4_;
      auVar128._16_4_ = auVar174._16_4_ + fVar202 * auVar21._16_4_;
      auVar128._20_4_ = auVar174._20_4_ + fVar206 * auVar21._20_4_;
      auVar128._24_4_ = auVar174._24_4_ + fVar209 * auVar21._24_4_;
      auVar128._28_4_ = auVar174._28_4_ + auVar21._28_4_;
      auVar21 = vsubps_avx(auVar128,auVar148);
      auVar163._0_4_ = auVar148._0_4_ + fVar176 * auVar21._0_4_;
      auVar163._4_4_ = auVar148._4_4_ + fVar178 * auVar21._4_4_;
      auVar163._8_4_ = auVar148._8_4_ + fVar180 * auVar21._8_4_;
      auVar163._12_4_ = auVar148._12_4_ + fVar182 * auVar21._12_4_;
      auVar175._16_4_ = auVar148._16_4_ + fVar202 * auVar21._16_4_;
      auVar175._0_16_ = auVar163;
      auVar175._20_4_ = auVar148._20_4_ + fVar206 * auVar21._20_4_;
      auVar175._24_4_ = auVar148._24_4_ + fVar209 * auVar21._24_4_;
      auVar175._28_4_ = auVar148._28_4_ + auVar174._28_4_;
      fVar176 = auVar21._4_4_ * 3.0;
      auVar141 = auVar175._16_16_;
      auVar117 = vshufps_avx(ZEXT416((uint)(fVar103 * 0.33333334)),
                             ZEXT416((uint)(fVar103 * 0.33333334)),0);
      auVar284._0_4_ = auVar163._0_4_ + auVar117._0_4_ * auVar21._0_4_ * 3.0;
      auVar284._4_4_ = auVar163._4_4_ + auVar117._4_4_ * fVar176;
      auVar284._8_4_ = auVar163._8_4_ + auVar117._8_4_ * auVar21._8_4_ * 3.0;
      auVar284._12_4_ = auVar163._12_4_ + auVar117._12_4_ * auVar21._12_4_ * 3.0;
      auVar225 = vshufpd_avx(auVar163,auVar163,3);
      auVar169 = vshufpd_avx(auVar141,auVar141,3);
      auVar118 = vsubps_avx(auVar225,auVar163);
      auVar190 = vsubps_avx(auVar169,auVar141);
      auVar115._0_4_ = auVar118._0_4_ + auVar190._0_4_;
      auVar115._4_4_ = auVar118._4_4_ + auVar190._4_4_;
      auVar115._8_4_ = auVar118._8_4_ + auVar190._8_4_;
      auVar115._12_4_ = auVar118._12_4_ + auVar190._12_4_;
      auVar118 = vmovshdup_avx(auVar163);
      auVar190 = vmovshdup_avx(auVar284);
      auVar168 = vshufps_avx(auVar115,auVar115,0);
      auVar92 = vshufps_avx(auVar115,auVar115,0x55);
      fVar206 = auVar92._0_4_;
      fVar209 = auVar92._4_4_;
      fVar210 = auVar92._8_4_;
      fVar149 = auVar92._12_4_;
      fVar178 = auVar168._0_4_;
      fVar180 = auVar168._4_4_;
      fVar182 = auVar168._8_4_;
      fVar202 = auVar168._12_4_;
      auVar272._0_4_ = fVar178 * auVar163._0_4_ + fVar206 * auVar118._0_4_;
      auVar272._4_4_ = fVar180 * auVar163._4_4_ + fVar209 * auVar118._4_4_;
      auVar272._8_4_ = fVar182 * auVar163._8_4_ + fVar210 * auVar118._8_4_;
      auVar272._12_4_ = fVar202 * auVar163._12_4_ + fVar149 * auVar118._12_4_;
      auVar285._0_4_ = auVar284._0_4_ * fVar178 + fVar206 * auVar190._0_4_;
      auVar285._4_4_ = auVar284._4_4_ * fVar180 + fVar209 * auVar190._4_4_;
      auVar285._8_4_ = auVar284._8_4_ * fVar182 + fVar210 * auVar190._8_4_;
      auVar285._12_4_ = auVar284._12_4_ * fVar202 + fVar149 * auVar190._12_4_;
      auVar190 = vshufps_avx(auVar272,auVar272,0xe8);
      auVar168 = vshufps_avx(auVar285,auVar285,0xe8);
      auVar118 = vcmpps_avx(auVar190,auVar168,1);
      uVar67 = vextractps_avx(auVar118,0);
      auVar92 = auVar285;
      if ((uVar67 & 1) == 0) {
        auVar92 = auVar272;
      }
      auVar116._0_4_ = auVar117._0_4_ * auVar21._16_4_ * 3.0;
      auVar116._4_4_ = auVar117._4_4_ * fVar176;
      auVar116._8_4_ = auVar117._8_4_ * auVar21._24_4_ * 3.0;
      auVar116._12_4_ = auVar117._12_4_ * auVar95._28_4_;
      auVar77 = vsubps_avx(auVar141,auVar116);
      auVar117 = vmovshdup_avx(auVar77);
      auVar141 = vmovshdup_avx(auVar141);
      fVar176 = auVar77._0_4_;
      fVar294 = auVar77._4_4_;
      auVar360._0_4_ = fVar178 * fVar176 + fVar206 * auVar117._0_4_;
      auVar360._4_4_ = fVar180 * fVar294 + fVar209 * auVar117._4_4_;
      auVar360._8_4_ = fVar182 * auVar77._8_4_ + fVar210 * auVar117._8_4_;
      auVar360._12_4_ = fVar202 * auVar77._12_4_ + fVar149 * auVar117._12_4_;
      auVar343._0_4_ = fVar178 * auVar175._16_4_ + fVar206 * auVar141._0_4_;
      auVar343._4_4_ = fVar180 * auVar175._20_4_ + fVar209 * auVar141._4_4_;
      auVar343._8_4_ = fVar182 * auVar175._24_4_ + fVar210 * auVar141._8_4_;
      auVar343._12_4_ = fVar202 * auVar175._28_4_ + fVar149 * auVar141._12_4_;
      auVar141 = vshufps_avx(auVar360,auVar360,0xe8);
      auVar16 = vshufps_avx(auVar343,auVar343,0xe8);
      auVar117 = vcmpps_avx(auVar141,auVar16,1);
      uVar67 = vextractps_avx(auVar117,0);
      auVar78 = auVar343;
      if ((uVar67 & 1) == 0) {
        auVar78 = auVar360;
      }
      auVar92 = vmaxss_avx(auVar78,auVar92);
      auVar190 = vminps_avx(auVar190,auVar168);
      auVar168 = vminps_avx(auVar141,auVar16);
      auVar168 = vminps_avx(auVar190,auVar168);
      auVar118 = vshufps_avx(auVar118,auVar118,0x55);
      auVar118 = vblendps_avx(auVar118,auVar117,2);
      auVar117 = vpslld_avx(auVar118,0x1f);
      auVar118 = vshufpd_avx(auVar285,auVar285,1);
      auVar118 = vinsertps_avx(auVar118,auVar343,0x9c);
      auVar190 = vshufpd_avx(auVar272,auVar272,1);
      auVar190 = vinsertps_avx(auVar190,auVar360,0x9c);
      auVar118 = vblendvps_avx(auVar190,auVar118,auVar117);
      auVar190 = vmovshdup_avx(auVar118);
      auVar118 = vmaxss_avx(auVar190,auVar118);
      fVar182 = auVar168._0_4_;
      auVar190 = vmovshdup_avx(auVar168);
      fVar180 = auVar118._0_4_;
      fVar202 = auVar190._0_4_;
      fVar178 = auVar92._0_4_;
      if ((0.0001 <= fVar182) || (fVar180 <= -0.0001)) {
        if ((-0.0001 < fVar178 && fVar202 < 0.0001) ||
           ((fVar182 < 0.0001 && -0.0001 < fVar178 || (fVar202 < 0.0001 && -0.0001 < fVar180))))
        goto LAB_01094696;
LAB_01095126:
        auVar363 = ZEXT1664(ZEXT816(0) << 0x40);
LAB_010950fb:
        bVar53 = true;
      }
      else {
LAB_01094696:
        auVar363 = ZEXT464(0) << 0x20;
        auVar117 = vcmpps_avx(auVar168,ZEXT416(0) << 0x20,1);
        auVar190 = vcmpss_avx(auVar92,ZEXT416(0),1);
        auVar352._8_4_ = 0x3f800000;
        auVar352._0_8_ = &DAT_3f8000003f800000;
        auVar352._12_4_ = 0x3f800000;
        auVar219._8_4_ = 0xbf800000;
        auVar219._0_8_ = 0xbf800000bf800000;
        auVar219._12_4_ = 0xbf800000;
        auVar190 = vblendvps_avx(auVar352,auVar219,auVar190);
        auVar117 = vblendvps_avx(auVar352,auVar219,auVar117);
        auVar141 = vcmpss_avx(auVar190,auVar117,4);
        auVar141 = vpshufd_avx(ZEXT416(auVar141._0_4_ & 1),0x50);
        auVar141 = vpslld_avx(auVar141,0x1f);
        auVar141 = vpsrad_avx(auVar141,0x1f);
        auVar141 = vpandn_avx(auVar141,_DAT_02020eb0);
        auVar16 = vmovshdup_avx(auVar117);
        fVar206 = auVar16._0_4_;
        if ((auVar117._0_4_ != fVar206) || (NAN(auVar117._0_4_) || NAN(fVar206))) {
          if ((fVar202 != fVar182) || (NAN(fVar202) || NAN(fVar182))) {
            fVar182 = -fVar182 / (fVar202 - fVar182);
            auVar117 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar182) * 0.0 + fVar182)));
          }
          else {
            auVar117 = vcmpss_avx(auVar168,ZEXT416(0),0);
            auVar117 = vpshufd_avx(ZEXT416(auVar117._0_4_ & 1),0x50);
            auVar117 = vpslld_avx(auVar117,0x1f);
            auVar117 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar117);
          }
          auVar16 = vcmpps_avx(auVar141,auVar117,1);
          auVar168 = vblendps_avx(auVar141,auVar117,2);
          auVar117 = vblendps_avx(auVar117,auVar141,2);
          auVar141 = vblendvps_avx(auVar117,auVar168,auVar16);
        }
        auVar118 = vcmpss_avx(auVar118,ZEXT416(0),1);
        auVar142._8_4_ = 0xbf800000;
        auVar142._0_8_ = 0xbf800000bf800000;
        auVar142._12_4_ = 0xbf800000;
        auVar118 = vblendvps_avx(auVar352,auVar142,auVar118);
        fVar182 = auVar118._0_4_;
        if ((auVar190._0_4_ != fVar182) || (NAN(auVar190._0_4_) || NAN(fVar182))) {
          if ((fVar180 != fVar178) || (NAN(fVar180) || NAN(fVar178))) {
            fVar178 = -fVar178 / (fVar180 - fVar178);
            auVar118 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar178) * 0.0 + fVar178)));
          }
          else {
            auVar118 = vcmpss_avx(auVar92,ZEXT416(0),0);
            auVar118 = vpshufd_avx(ZEXT416(auVar118._0_4_ & 1),0x50);
            auVar118 = vpslld_avx(auVar118,0x1f);
            auVar118 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar118);
          }
          auVar117 = vcmpps_avx(auVar141,auVar118,1);
          auVar190 = vblendps_avx(auVar141,auVar118,2);
          auVar118 = vblendps_avx(auVar118,auVar141,2);
          auVar141 = vblendvps_avx(auVar118,auVar190,auVar117);
        }
        if ((fVar206 != fVar182) || (NAN(fVar206) || NAN(fVar182))) {
          auVar118 = vcmpps_avx(auVar141,auVar352,1);
          auVar190 = vinsertps_avx(auVar141,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar220._4_12_ = auVar141._4_12_;
          auVar220._0_4_ = 0x3f800000;
          auVar141 = vblendvps_avx(auVar220,auVar190,auVar118);
        }
        auVar118 = vcmpps_avx(auVar141,_DAT_01fec6f0,1);
        auVar54._12_4_ = 0;
        auVar54._0_12_ = auVar141._4_12_;
        auVar190 = vinsertps_avx(auVar141,ZEXT416(0x3f800000),0x10);
        auVar118 = vblendvps_avx(auVar190,auVar54 << 0x20,auVar118);
        auVar190 = vmovshdup_avx(auVar118);
        bVar53 = true;
        if (auVar118._0_4_ <= auVar190._0_4_) {
          auVar119._0_4_ = auVar118._0_4_ + -0.1;
          auVar119._4_4_ = auVar118._4_4_ + 0.1;
          auVar119._8_4_ = auVar118._8_4_ + 0.0;
          auVar119._12_4_ = auVar118._12_4_ + 0.0;
          auVar117 = vshufpd_avx(auVar284,auVar284,3);
          auVar164._8_8_ = 0x3f80000000000000;
          auVar164._0_8_ = 0x3f80000000000000;
          auVar118 = vcmpps_avx(auVar119,auVar164,1);
          auVar55._12_4_ = 0;
          auVar55._0_12_ = auVar119._4_12_;
          auVar190 = vinsertps_avx(auVar119,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar118 = vblendvps_avx(auVar190,auVar55 << 0x20,auVar118);
          auVar190 = vshufpd_avx(auVar77,auVar77,3);
          auVar168 = vshufps_avx(auVar118,auVar118,0x50);
          auVar92 = vsubps_avx(auVar352,auVar168);
          local_620 = auVar225._0_4_;
          fStack_61c = auVar225._4_4_;
          fStack_618 = auVar225._8_4_;
          fStack_614 = auVar225._12_4_;
          fVar178 = auVar168._0_4_;
          fVar180 = auVar168._4_4_;
          fVar182 = auVar168._8_4_;
          fVar202 = auVar168._12_4_;
          local_6a0 = auVar169._0_4_;
          fStack_69c = auVar169._4_4_;
          fStack_698 = auVar169._8_4_;
          fStack_694 = auVar169._12_4_;
          fVar206 = auVar92._0_4_;
          fVar209 = auVar92._4_4_;
          fVar210 = auVar92._8_4_;
          fVar149 = auVar92._12_4_;
          auVar143._0_4_ = fVar178 * local_620 + fVar206 * auVar163._0_4_;
          auVar143._4_4_ = fVar180 * fStack_61c + fVar209 * auVar163._4_4_;
          auVar143._8_4_ = fVar182 * fStack_618 + fVar210 * auVar163._0_4_;
          auVar143._12_4_ = fVar202 * fStack_614 + fVar149 * auVar163._4_4_;
          auVar192._0_4_ = fVar178 * auVar117._0_4_ + fVar206 * auVar284._0_4_;
          auVar192._4_4_ = fVar180 * auVar117._4_4_ + fVar209 * auVar284._4_4_;
          auVar192._8_4_ = fVar182 * auVar117._8_4_ + fVar210 * auVar284._0_4_;
          auVar192._12_4_ = fVar202 * auVar117._12_4_ + fVar149 * auVar284._4_4_;
          auVar255._0_4_ = fVar178 * auVar190._0_4_ + fVar206 * fVar176;
          auVar255._4_4_ = fVar180 * auVar190._4_4_ + fVar209 * fVar294;
          auVar255._8_4_ = fVar182 * auVar190._8_4_ + fVar210 * fVar176;
          auVar255._12_4_ = fVar202 * auVar190._12_4_ + fVar149 * fVar294;
          auVar273._0_4_ = fVar178 * local_6a0 + fVar206 * auVar175._16_4_;
          auVar273._4_4_ = fVar180 * fStack_69c + fVar209 * auVar175._20_4_;
          auVar273._8_4_ = fVar182 * fStack_698 + fVar210 * auVar175._16_4_;
          auVar273._12_4_ = fVar202 * fStack_694 + fVar149 * auVar175._20_4_;
          auVar169 = vsubps_avx(auVar352,auVar118);
          auVar190 = vmovshdup_avx(_local_6f0);
          auVar225 = vmovsldup_avx(_local_6f0);
          local_6f0._0_4_ = auVar169._0_4_ * auVar225._0_4_ + auVar190._0_4_ * auVar118._0_4_;
          local_6f0._4_4_ = auVar169._4_4_ * auVar225._4_4_ + auVar190._4_4_ * auVar118._4_4_;
          fStack_6e8 = auVar169._8_4_ * auVar225._8_4_ + auVar190._8_4_ * auVar118._8_4_;
          fStack_6e4 = auVar169._12_4_ * auVar225._12_4_ + auVar190._12_4_ * auVar118._12_4_;
          auVar77 = vmovshdup_avx(_local_6f0);
          auVar118 = vsubps_avx(auVar192,auVar143);
          auVar221._0_4_ = auVar118._0_4_ * 3.0;
          auVar221._4_4_ = auVar118._4_4_ * 3.0;
          auVar221._8_4_ = auVar118._8_4_ * 3.0;
          auVar221._12_4_ = auVar118._12_4_ * 3.0;
          auVar118 = vsubps_avx(auVar255,auVar192);
          auVar236._0_4_ = auVar118._0_4_ * 3.0;
          auVar236._4_4_ = auVar118._4_4_ * 3.0;
          auVar236._8_4_ = auVar118._8_4_ * 3.0;
          auVar236._12_4_ = auVar118._12_4_ * 3.0;
          auVar118 = vsubps_avx(auVar273,auVar255);
          auVar286._0_4_ = auVar118._0_4_ * 3.0;
          auVar286._4_4_ = auVar118._4_4_ * 3.0;
          auVar286._8_4_ = auVar118._8_4_ * 3.0;
          auVar286._12_4_ = auVar118._12_4_ * 3.0;
          auVar190 = vminps_avx(auVar236,auVar286);
          auVar118 = vmaxps_avx(auVar236,auVar286);
          auVar190 = vminps_avx(auVar221,auVar190);
          auVar118 = vmaxps_avx(auVar221,auVar118);
          auVar225 = vshufpd_avx(auVar190,auVar190,3);
          auVar169 = vshufpd_avx(auVar118,auVar118,3);
          auVar190 = vminps_avx(auVar190,auVar225);
          auVar118 = vmaxps_avx(auVar118,auVar169);
          auVar225 = vshufps_avx(ZEXT416((uint)(1.0 / fVar103)),ZEXT416((uint)(1.0 / fVar103)),0);
          auVar222._0_4_ = auVar225._0_4_ * auVar190._0_4_;
          auVar222._4_4_ = auVar225._4_4_ * auVar190._4_4_;
          auVar222._8_4_ = auVar225._8_4_ * auVar190._8_4_;
          auVar222._12_4_ = auVar225._12_4_ * auVar190._12_4_;
          auVar237._0_4_ = auVar118._0_4_ * auVar225._0_4_;
          auVar237._4_4_ = auVar118._4_4_ * auVar225._4_4_;
          auVar237._8_4_ = auVar118._8_4_ * auVar225._8_4_;
          auVar237._12_4_ = auVar118._12_4_ * auVar225._12_4_;
          auVar92 = ZEXT416((uint)(1.0 / (auVar77._0_4_ - (float)local_6f0._0_4_)));
          auVar118 = vshufpd_avx(auVar143,auVar143,3);
          auVar190 = vshufpd_avx(auVar192,auVar192,3);
          auVar225 = vshufpd_avx(auVar255,auVar255,3);
          auVar169 = vshufpd_avx(auVar273,auVar273,3);
          auVar118 = vsubps_avx(auVar118,auVar143);
          auVar117 = vsubps_avx(auVar190,auVar192);
          auVar168 = vsubps_avx(auVar225,auVar255);
          auVar169 = vsubps_avx(auVar169,auVar273);
          auVar190 = vminps_avx(auVar118,auVar117);
          auVar118 = vmaxps_avx(auVar118,auVar117);
          auVar225 = vminps_avx(auVar168,auVar169);
          auVar225 = vminps_avx(auVar190,auVar225);
          auVar190 = vmaxps_avx(auVar168,auVar169);
          auVar118 = vmaxps_avx(auVar118,auVar190);
          auVar190 = vshufps_avx(auVar92,auVar92,0);
          auVar303._0_4_ = auVar190._0_4_ * auVar225._0_4_;
          auVar303._4_4_ = auVar190._4_4_ * auVar225._4_4_;
          auVar303._8_4_ = auVar190._8_4_ * auVar225._8_4_;
          auVar303._12_4_ = auVar190._12_4_ * auVar225._12_4_;
          auVar311._0_4_ = auVar190._0_4_ * auVar118._0_4_;
          auVar311._4_4_ = auVar190._4_4_ * auVar118._4_4_;
          auVar311._8_4_ = auVar190._8_4_ * auVar118._8_4_;
          auVar311._12_4_ = auVar190._12_4_ * auVar118._12_4_;
          auVar118 = vmovsldup_avx(_local_6f0);
          auVar256._4_12_ = auVar118._4_12_;
          auVar256._0_4_ = fVar150;
          auVar274._4_12_ = local_6f0._4_12_;
          auVar274._0_4_ = fVar101;
          auVar93._0_4_ = (fVar101 + fVar150) * 0.5;
          auVar93._4_4_ = ((float)local_6f0._4_4_ + auVar118._4_4_) * 0.5;
          auVar93._8_4_ = (fStack_6e8 + auVar118._8_4_) * 0.5;
          auVar93._12_4_ = (fStack_6e4 + auVar118._12_4_) * 0.5;
          auVar118 = vshufps_avx(auVar93,auVar93,0);
          fVar176 = auVar118._0_4_;
          fVar178 = auVar118._4_4_;
          fVar180 = auVar118._8_4_;
          fVar182 = auVar118._12_4_;
          local_6e0 = auVar268._0_4_;
          fStack_6dc = auVar268._4_4_;
          fStack_6d8 = auVar268._8_4_;
          fStack_6d4 = auVar268._12_4_;
          auVar193._0_4_ = fVar176 * (float)local_330._0_4_ + local_6e0;
          auVar193._4_4_ = fVar178 * (float)local_330._4_4_ + fStack_6dc;
          auVar193._8_4_ = fVar180 * fStack_328 + fStack_6d8;
          auVar193._12_4_ = fVar182 * fStack_324 + fStack_6d4;
          local_5e0 = auVar233._0_4_;
          fStack_5dc = auVar233._4_4_;
          fStack_5d8 = auVar233._8_4_;
          fStack_5d4 = auVar233._12_4_;
          auVar287._0_4_ = fVar176 * (float)local_340._0_4_ + local_5e0;
          auVar287._4_4_ = fVar178 * (float)local_340._4_4_ + fStack_5dc;
          auVar287._8_4_ = fVar180 * fStack_338 + fStack_5d8;
          auVar287._12_4_ = fVar182 * fStack_334 + fStack_5d4;
          local_5f0 = auVar15._0_4_;
          fStack_5ec = auVar15._4_4_;
          fStack_5e8 = auVar15._8_4_;
          fStack_5e4 = auVar15._12_4_;
          auVar328._0_4_ = fVar176 * (float)local_350._0_4_ + local_5f0;
          auVar328._4_4_ = fVar178 * (float)local_350._4_4_ + fStack_5ec;
          auVar328._8_4_ = fVar180 * fStack_348 + fStack_5e8;
          auVar328._12_4_ = fVar182 * fStack_344 + fStack_5e4;
          auVar118 = vsubps_avx(auVar287,auVar193);
          auVar194._0_4_ = auVar118._0_4_ * fVar176 + auVar193._0_4_;
          auVar194._4_4_ = auVar118._4_4_ * fVar178 + auVar193._4_4_;
          auVar194._8_4_ = auVar118._8_4_ * fVar180 + auVar193._8_4_;
          auVar194._12_4_ = auVar118._12_4_ * fVar182 + auVar193._12_4_;
          auVar118 = vsubps_avx(auVar328,auVar287);
          auVar288._0_4_ = auVar287._0_4_ + auVar118._0_4_ * fVar176;
          auVar288._4_4_ = auVar287._4_4_ + auVar118._4_4_ * fVar178;
          auVar288._8_4_ = auVar287._8_4_ + auVar118._8_4_ * fVar180;
          auVar288._12_4_ = auVar287._12_4_ + auVar118._12_4_ * fVar182;
          auVar118 = vsubps_avx(auVar288,auVar194);
          fVar176 = auVar194._0_4_ + auVar118._0_4_ * fVar176;
          fVar178 = auVar194._4_4_ + auVar118._4_4_ * fVar178;
          auVar144._0_8_ = CONCAT44(fVar178,fVar176);
          auVar144._8_4_ = auVar194._8_4_ + auVar118._8_4_ * fVar180;
          auVar144._12_4_ = auVar194._12_4_ + auVar118._12_4_ * fVar182;
          fVar180 = auVar118._0_4_ * 3.0;
          fVar182 = auVar118._4_4_ * 3.0;
          auVar195._0_8_ = CONCAT44(fVar182,fVar180);
          auVar195._8_4_ = auVar118._8_4_ * 3.0;
          auVar195._12_4_ = auVar118._12_4_ * 3.0;
          auVar289._8_8_ = auVar144._0_8_;
          auVar289._0_8_ = auVar144._0_8_;
          auVar118 = vshufpd_avx(auVar144,auVar144,3);
          auVar190 = vshufps_avx(auVar93,auVar93,0x55);
          auVar168 = vsubps_avx(auVar118,auVar289);
          auVar290._0_4_ = auVar190._0_4_ * auVar168._0_4_ + fVar176;
          auVar290._4_4_ = auVar190._4_4_ * auVar168._4_4_ + fVar178;
          auVar290._8_4_ = auVar190._8_4_ * auVar168._8_4_ + fVar176;
          auVar290._12_4_ = auVar190._12_4_ * auVar168._12_4_ + fVar178;
          auVar344._8_8_ = auVar195._0_8_;
          auVar344._0_8_ = auVar195._0_8_;
          auVar118 = vshufpd_avx(auVar195,auVar195,1);
          auVar118 = vsubps_avx(auVar118,auVar344);
          auVar196._0_4_ = fVar180 + auVar190._0_4_ * auVar118._0_4_;
          auVar196._4_4_ = fVar182 + auVar190._4_4_ * auVar118._4_4_;
          auVar196._8_4_ = fVar180 + auVar190._8_4_ * auVar118._8_4_;
          auVar196._12_4_ = fVar182 + auVar190._12_4_ * auVar118._12_4_;
          auVar190 = vmovshdup_avx(auVar196);
          auVar345._0_8_ = auVar190._0_8_ ^ 0x8000000080000000;
          auVar345._8_4_ = auVar190._8_4_ ^ 0x80000000;
          auVar345._12_4_ = auVar190._12_4_ ^ 0x80000000;
          auVar225 = vmovshdup_avx(auVar168);
          auVar118 = vunpcklps_avx(auVar225,auVar345);
          auVar169 = vshufps_avx(auVar118,auVar345,4);
          auVar145._0_8_ = auVar168._0_8_ ^ 0x8000000080000000;
          auVar145._8_4_ = -auVar168._8_4_;
          auVar145._12_4_ = -auVar168._12_4_;
          auVar118 = vmovlhps_avx(auVar145,auVar196);
          auVar117 = vshufps_avx(auVar118,auVar196,8);
          auVar118 = ZEXT416((uint)(auVar225._0_4_ * auVar196._0_4_ -
                                   auVar190._0_4_ * auVar168._0_4_));
          auVar190 = vshufps_avx(auVar118,auVar118,0);
          auVar118 = vdivps_avx(auVar169,auVar190);
          auVar190 = vdivps_avx(auVar117,auVar190);
          auVar117 = vinsertps_avx(auVar222,auVar303,0x1c);
          auVar168 = vinsertps_avx(auVar237,auVar311,0x1c);
          auVar92 = vinsertps_avx(auVar303,auVar222,0x4c);
          auVar141 = vinsertps_avx(auVar311,auVar237,0x4c);
          auVar225 = vmovsldup_avx(auVar118);
          auVar312._0_4_ = auVar225._0_4_ * auVar117._0_4_;
          auVar312._4_4_ = auVar225._4_4_ * auVar117._4_4_;
          auVar312._8_4_ = auVar225._8_4_ * auVar117._8_4_;
          auVar312._12_4_ = auVar225._12_4_ * auVar117._12_4_;
          auVar304._0_4_ = auVar225._0_4_ * auVar168._0_4_;
          auVar304._4_4_ = auVar225._4_4_ * auVar168._4_4_;
          auVar304._8_4_ = auVar225._8_4_ * auVar168._8_4_;
          auVar304._12_4_ = auVar225._12_4_ * auVar168._12_4_;
          auVar169 = vminps_avx(auVar312,auVar304);
          auVar225 = vmaxps_avx(auVar304,auVar312);
          auVar16 = vmovsldup_avx(auVar190);
          auVar361._0_4_ = auVar16._0_4_ * auVar92._0_4_;
          auVar361._4_4_ = auVar16._4_4_ * auVar92._4_4_;
          auVar361._8_4_ = auVar16._8_4_ * auVar92._8_4_;
          auVar361._12_4_ = auVar16._12_4_ * auVar92._12_4_;
          auVar305._0_4_ = auVar16._0_4_ * auVar141._0_4_;
          auVar305._4_4_ = auVar16._4_4_ * auVar141._4_4_;
          auVar305._8_4_ = auVar16._8_4_ * auVar141._8_4_;
          auVar305._12_4_ = auVar16._12_4_ * auVar141._12_4_;
          auVar16 = vminps_avx(auVar361,auVar305);
          auVar120._0_4_ = auVar169._0_4_ + auVar16._0_4_;
          auVar120._4_4_ = auVar169._4_4_ + auVar16._4_4_;
          auVar120._8_4_ = auVar169._8_4_ + auVar16._8_4_;
          auVar120._12_4_ = auVar169._12_4_ + auVar16._12_4_;
          auVar169 = vmaxps_avx(auVar305,auVar361);
          auVar16 = vsubps_avx(auVar256,auVar93);
          auVar78 = vsubps_avx(auVar274,auVar93);
          auVar275._0_4_ = auVar225._0_4_ + auVar169._0_4_;
          auVar275._4_4_ = auVar225._4_4_ + auVar169._4_4_;
          auVar275._8_4_ = auVar225._8_4_ + auVar169._8_4_;
          auVar275._12_4_ = auVar225._12_4_ + auVar169._12_4_;
          auVar313._8_8_ = 0x3f800000;
          auVar313._0_8_ = 0x3f800000;
          auVar225 = vsubps_avx(auVar313,auVar275);
          auVar169 = vsubps_avx(auVar313,auVar120);
          fVar209 = auVar16._0_4_;
          auVar314._0_4_ = fVar209 * auVar225._0_4_;
          fVar210 = auVar16._4_4_;
          auVar314._4_4_ = fVar210 * auVar225._4_4_;
          fVar149 = auVar16._8_4_;
          auVar314._8_4_ = fVar149 * auVar225._8_4_;
          fVar294 = auVar16._12_4_;
          auVar314._12_4_ = fVar294 * auVar225._12_4_;
          fVar180 = auVar78._0_4_;
          auVar276._0_4_ = auVar225._0_4_ * fVar180;
          fVar182 = auVar78._4_4_;
          auVar276._4_4_ = auVar225._4_4_ * fVar182;
          fVar202 = auVar78._8_4_;
          auVar276._8_4_ = auVar225._8_4_ * fVar202;
          fVar206 = auVar78._12_4_;
          auVar276._12_4_ = auVar225._12_4_ * fVar206;
          auVar353._0_4_ = fVar209 * auVar169._0_4_;
          auVar353._4_4_ = fVar210 * auVar169._4_4_;
          auVar353._8_4_ = fVar149 * auVar169._8_4_;
          auVar353._12_4_ = fVar294 * auVar169._12_4_;
          auVar121._0_4_ = fVar180 * auVar169._0_4_;
          auVar121._4_4_ = fVar182 * auVar169._4_4_;
          auVar121._8_4_ = fVar202 * auVar169._8_4_;
          auVar121._12_4_ = fVar206 * auVar169._12_4_;
          auVar225 = vminps_avx(auVar314,auVar353);
          auVar169 = vminps_avx(auVar276,auVar121);
          auVar16 = vminps_avx(auVar225,auVar169);
          auVar225 = vmaxps_avx(auVar353,auVar314);
          auVar169 = vmaxps_avx(auVar121,auVar276);
          auVar78 = vshufps_avx(auVar93,auVar93,0x54);
          auVar169 = vmaxps_avx(auVar169,auVar225);
          auVar79 = vshufps_avx(auVar290,auVar290,0);
          auVar105 = vshufps_avx(auVar290,auVar290,0x55);
          auVar225 = vhaddps_avx(auVar16,auVar16);
          auVar169 = vhaddps_avx(auVar169,auVar169);
          auVar277._0_4_ = auVar79._0_4_ * auVar118._0_4_ + auVar105._0_4_ * auVar190._0_4_;
          auVar277._4_4_ = auVar79._4_4_ * auVar118._4_4_ + auVar105._4_4_ * auVar190._4_4_;
          auVar277._8_4_ = auVar79._8_4_ * auVar118._8_4_ + auVar105._8_4_ * auVar190._8_4_;
          auVar277._12_4_ = auVar79._12_4_ * auVar118._12_4_ + auVar105._12_4_ * auVar190._12_4_;
          auVar16 = vsubps_avx(auVar78,auVar277);
          fVar176 = auVar16._0_4_ + auVar225._0_4_;
          fVar178 = auVar16._0_4_ + auVar169._0_4_;
          auVar225 = vmaxss_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar176));
          auVar169 = vminss_avx(ZEXT416((uint)fVar178),ZEXT416((uint)fVar101));
          if (auVar225._0_4_ <= auVar169._0_4_) {
            auVar225 = vmovshdup_avx(auVar118);
            auVar165._0_4_ = auVar117._0_4_ * auVar225._0_4_;
            auVar165._4_4_ = auVar117._4_4_ * auVar225._4_4_;
            auVar165._8_4_ = auVar117._8_4_ * auVar225._8_4_;
            auVar165._12_4_ = auVar117._12_4_ * auVar225._12_4_;
            auVar122._0_4_ = auVar168._0_4_ * auVar225._0_4_;
            auVar122._4_4_ = auVar168._4_4_ * auVar225._4_4_;
            auVar122._8_4_ = auVar168._8_4_ * auVar225._8_4_;
            auVar122._12_4_ = auVar168._12_4_ * auVar225._12_4_;
            auVar169 = vminps_avx(auVar165,auVar122);
            auVar225 = vmaxps_avx(auVar122,auVar165);
            auVar117 = vmovshdup_avx(auVar190);
            auVar223._0_4_ = auVar117._0_4_ * auVar92._0_4_;
            auVar223._4_4_ = auVar117._4_4_ * auVar92._4_4_;
            auVar223._8_4_ = auVar117._8_4_ * auVar92._8_4_;
            auVar223._12_4_ = auVar117._12_4_ * auVar92._12_4_;
            auVar166._0_4_ = auVar117._0_4_ * auVar141._0_4_;
            auVar166._4_4_ = auVar117._4_4_ * auVar141._4_4_;
            auVar166._8_4_ = auVar117._8_4_ * auVar141._8_4_;
            auVar166._12_4_ = auVar117._12_4_ * auVar141._12_4_;
            auVar117 = vminps_avx(auVar223,auVar166);
            auVar238._0_4_ = auVar169._0_4_ + auVar117._0_4_;
            auVar238._4_4_ = auVar169._4_4_ + auVar117._4_4_;
            auVar238._8_4_ = auVar169._8_4_ + auVar117._8_4_;
            auVar238._12_4_ = auVar169._12_4_ + auVar117._12_4_;
            auVar169 = vmaxps_avx(auVar166,auVar223);
            auVar123._0_4_ = auVar225._0_4_ + auVar169._0_4_;
            auVar123._4_4_ = auVar225._4_4_ + auVar169._4_4_;
            auVar123._8_4_ = auVar225._8_4_ + auVar169._8_4_;
            auVar123._12_4_ = auVar225._12_4_ + auVar169._12_4_;
            auVar225 = vsubps_avx(auVar164,auVar123);
            auVar169 = vsubps_avx(auVar164,auVar238);
            auVar224._0_4_ = fVar209 * auVar225._0_4_;
            auVar224._4_4_ = fVar210 * auVar225._4_4_;
            auVar224._8_4_ = fVar149 * auVar225._8_4_;
            auVar224._12_4_ = fVar294 * auVar225._12_4_;
            auVar239._0_4_ = fVar209 * auVar169._0_4_;
            auVar239._4_4_ = fVar210 * auVar169._4_4_;
            auVar239._8_4_ = fVar149 * auVar169._8_4_;
            auVar239._12_4_ = fVar294 * auVar169._12_4_;
            auVar124._0_4_ = fVar180 * auVar225._0_4_;
            auVar124._4_4_ = fVar182 * auVar225._4_4_;
            auVar124._8_4_ = fVar202 * auVar225._8_4_;
            auVar124._12_4_ = fVar206 * auVar225._12_4_;
            auVar167._0_4_ = fVar180 * auVar169._0_4_;
            auVar167._4_4_ = fVar182 * auVar169._4_4_;
            auVar167._8_4_ = fVar202 * auVar169._8_4_;
            auVar167._12_4_ = fVar206 * auVar169._12_4_;
            auVar225 = vminps_avx(auVar224,auVar239);
            auVar169 = vminps_avx(auVar124,auVar167);
            auVar225 = vminps_avx(auVar225,auVar169);
            auVar169 = vmaxps_avx(auVar239,auVar224);
            auVar117 = vmaxps_avx(auVar167,auVar124);
            auVar225 = vhaddps_avx(auVar225,auVar225);
            auVar169 = vmaxps_avx(auVar117,auVar169);
            auVar169 = vhaddps_avx(auVar169,auVar169);
            auVar117 = vmovshdup_avx(auVar16);
            auVar168 = ZEXT416((uint)(auVar117._0_4_ + auVar225._0_4_));
            auVar225 = vmaxss_avx(_local_6f0,auVar168);
            auVar117 = ZEXT416((uint)(auVar117._0_4_ + auVar169._0_4_));
            auVar169 = vminss_avx(auVar117,auVar77);
            auVar354._8_4_ = 0x7fffffff;
            auVar354._0_8_ = 0x7fffffff7fffffff;
            auVar354._12_4_ = 0x7fffffff;
            if (auVar225._0_4_ <= auVar169._0_4_) {
              uVar67 = 0;
              auVar363 = ZEXT864(0) << 0x20;
              if ((fVar150 < fVar176) && (uVar67 = 0, fVar178 < fVar101)) {
                auVar225 = vcmpps_avx(auVar117,auVar77,1);
                auVar169 = vcmpps_avx(_local_6f0,auVar168,1);
                auVar225 = vandps_avx(auVar169,auVar225);
                uVar67 = auVar225._0_4_;
              }
              if (((uint)uVar69 < 4 && 0.001 <= fVar103) && (uVar67 & 1) == 0) {
                bVar53 = false;
              }
              else {
                lVar70 = 200;
                do {
                  fVar176 = auVar16._0_4_;
                  fVar103 = 1.0 - fVar176;
                  auVar225 = ZEXT416((uint)(fVar103 * fVar103 * fVar103));
                  auVar225 = vshufps_avx(auVar225,auVar225,0);
                  auVar169 = ZEXT416((uint)(fVar176 * 3.0 * fVar103 * fVar103));
                  auVar169 = vshufps_avx(auVar169,auVar169,0);
                  auVar117 = ZEXT416((uint)(fVar103 * fVar176 * fVar176 * 3.0));
                  auVar117 = vshufps_avx(auVar117,auVar117,0);
                  auVar168 = ZEXT416((uint)(fVar176 * fVar176 * fVar176));
                  auVar168 = vshufps_avx(auVar168,auVar168,0);
                  fVar103 = local_6e0 * auVar225._0_4_ +
                            local_5e0 * auVar169._0_4_ +
                            (float)local_470._0_4_ * auVar168._0_4_ + local_5f0 * auVar117._0_4_;
                  fVar176 = fStack_6dc * auVar225._4_4_ +
                            fStack_5dc * auVar169._4_4_ +
                            (float)local_470._4_4_ * auVar168._4_4_ + fStack_5ec * auVar117._4_4_;
                  auVar125._0_8_ = CONCAT44(fVar176,fVar103);
                  auVar125._8_4_ =
                       fStack_6d8 * auVar225._8_4_ +
                       fStack_5d8 * auVar169._8_4_ +
                       fStack_468 * auVar168._8_4_ + fStack_5e8 * auVar117._8_4_;
                  auVar125._12_4_ =
                       fStack_6d4 * auVar225._12_4_ +
                       fStack_5d4 * auVar169._12_4_ +
                       fStack_464 * auVar168._12_4_ + fStack_5e4 * auVar117._12_4_;
                  auVar170._8_8_ = auVar125._0_8_;
                  auVar170._0_8_ = auVar125._0_8_;
                  auVar169 = vshufpd_avx(auVar125,auVar125,1);
                  auVar225 = vmovshdup_avx(auVar16);
                  auVar169 = vsubps_avx(auVar169,auVar170);
                  auVar126._0_4_ = auVar225._0_4_ * auVar169._0_4_ + fVar103;
                  auVar126._4_4_ = auVar225._4_4_ * auVar169._4_4_ + fVar176;
                  auVar126._8_4_ = auVar225._8_4_ * auVar169._8_4_ + fVar103;
                  auVar126._12_4_ = auVar225._12_4_ * auVar169._12_4_ + fVar176;
                  auVar225 = vshufps_avx(auVar126,auVar126,0);
                  auVar169 = vshufps_avx(auVar126,auVar126,0x55);
                  auVar171._0_4_ = auVar118._0_4_ * auVar225._0_4_ + auVar190._0_4_ * auVar169._0_4_
                  ;
                  auVar171._4_4_ = auVar118._4_4_ * auVar225._4_4_ + auVar190._4_4_ * auVar169._4_4_
                  ;
                  auVar171._8_4_ = auVar118._8_4_ * auVar225._8_4_ + auVar190._8_4_ * auVar169._8_4_
                  ;
                  auVar171._12_4_ =
                       auVar118._12_4_ * auVar225._12_4_ + auVar190._12_4_ * auVar169._12_4_;
                  auVar16 = vsubps_avx(auVar16,auVar171);
                  auVar225 = vandps_avx(auVar354,auVar126);
                  auVar169 = vshufps_avx(auVar225,auVar225,0xf5);
                  auVar225 = vmaxss_avx(auVar169,auVar225);
                  if (auVar225._0_4_ < fVar76) {
                    fVar103 = auVar16._0_4_;
                    if ((0.0 <= fVar103) && (fVar103 <= 1.0)) {
                      auVar118 = vmovshdup_avx(auVar16);
                      fVar176 = auVar118._0_4_;
                      if ((0.0 <= fVar176) && (fVar176 <= 1.0)) {
                        auVar118 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2])
                                                 ,ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]
                                                         ),0x1c);
                        auVar141 = vinsertps_avx(auVar118,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                        auVar118 = vdpps_avx(auVar141,local_360,0x7f);
                        auVar190 = vdpps_avx(auVar141,local_370,0x7f);
                        auVar225 = vdpps_avx(auVar141,local_380,0x7f);
                        auVar169 = vdpps_avx(auVar141,local_390,0x7f);
                        auVar117 = vdpps_avx(auVar141,local_3a0,0x7f);
                        auVar168 = vdpps_avx(auVar141,local_3b0,0x7f);
                        auVar92 = vdpps_avx(auVar141,local_3c0,0x7f);
                        auVar141 = vdpps_avx(auVar141,local_3d0,0x7f);
                        fVar206 = 1.0 - fVar176;
                        fVar209 = 1.0 - fVar103;
                        fVar178 = auVar16._4_4_;
                        fVar180 = auVar16._8_4_;
                        fVar182 = auVar16._12_4_;
                        fVar202 = fVar209 * fVar103 * fVar103 * 3.0;
                        auVar257._0_4_ = fVar103 * fVar103 * fVar103;
                        auVar257._4_4_ = fVar178 * fVar178 * fVar178;
                        auVar257._8_4_ = fVar180 * fVar180 * fVar180;
                        auVar257._12_4_ = fVar182 * fVar182 * fVar182;
                        fVar180 = fVar209 * fVar209 * fVar103 * 3.0;
                        fVar182 = fVar209 * fVar209 * fVar209;
                        fVar178 = fVar182 * (fVar206 * auVar118._0_4_ + fVar176 * auVar117._0_4_) +
                                  (fVar206 * auVar190._0_4_ + auVar168._0_4_ * fVar176) * fVar180 +
                                  fVar202 * (auVar92._0_4_ * fVar176 + fVar206 * auVar225._0_4_) +
                                  auVar257._0_4_ *
                                  (fVar206 * auVar169._0_4_ + fVar176 * auVar141._0_4_);
                        if (((fVar104 <= fVar178) &&
                            (fVar206 = *(float *)(ray + k * 4 + 0x100), fVar178 <= fVar206)) &&
                           (pGVar9 = (context->scene->geometries).items[uVar74].ptr,
                           (pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
                          auStack_f0 = vshufps_avx(auVar16,auVar16,0x55);
                          auVar291._8_4_ = 0x3f800000;
                          auVar291._0_8_ = &DAT_3f8000003f800000;
                          auVar291._12_4_ = 0x3f800000;
                          auVar118 = vsubps_avx(auVar291,auStack_f0);
                          fVar210 = auStack_f0._0_4_;
                          fVar149 = auStack_f0._4_4_;
                          fVar294 = auStack_f0._8_4_;
                          fVar295 = auStack_f0._12_4_;
                          fVar308 = auVar118._0_4_;
                          fVar184 = auVar118._4_4_;
                          fVar204 = auVar118._8_4_;
                          fVar208 = auVar118._12_4_;
                          auVar306._0_4_ =
                               fVar210 * (float)local_4a0._0_4_ + fVar308 * (float)local_480._0_4_;
                          auVar306._4_4_ =
                               fVar149 * (float)local_4a0._4_4_ + fVar184 * (float)local_480._4_4_;
                          auVar306._8_4_ = fVar294 * fStack_498 + fVar204 * fStack_478;
                          auVar306._12_4_ = fVar295 * fStack_494 + fVar208 * fStack_474;
                          auVar315._0_4_ = fVar210 * (float)local_4b0._0_4_ + fVar308 * fVar213;
                          auVar315._4_4_ = fVar149 * (float)local_4b0._4_4_ + fVar184 * fVar229;
                          auVar315._8_4_ = fVar294 * fStack_4a8 + fVar204 * fVar177;
                          auVar315._12_4_ = fVar295 * fStack_4a4 + fVar208 * fVar183;
                          auVar329._0_4_ = fVar210 * fVar228 + fVar308 * (float)local_490._0_4_;
                          auVar329._4_4_ = fVar149 * fVar151 + fVar184 * (float)local_490._4_4_;
                          auVar329._8_4_ = fVar294 * fVar181 + fVar204 * fStack_488;
                          auVar329._12_4_ = fVar295 * fVar207 + fVar208 * fStack_484;
                          auVar292._0_4_ = fVar210 * (float)local_3f0._0_4_ + fVar308 * fVar227;
                          auVar292._4_4_ = fVar149 * (float)local_3f0._4_4_ + fVar184 * fVar102;
                          auVar292._8_4_ = fVar294 * fStack_3e8 + fVar204 * fVar179;
                          auVar292._12_4_ = fVar295 * fStack_3e4 + fVar208 * fVar203;
                          auVar169 = vsubps_avx(auVar315,auVar306);
                          auVar117 = vsubps_avx(auVar329,auVar315);
                          auVar168 = vsubps_avx(auVar292,auVar329);
                          auStack_110 = vshufps_avx(auVar16,auVar16,0);
                          fVar295 = auStack_110._0_4_;
                          fVar308 = auStack_110._4_4_;
                          fVar184 = auStack_110._8_4_;
                          fVar204 = auStack_110._12_4_;
                          auVar118 = vshufps_avx(ZEXT416((uint)fVar209),ZEXT416((uint)fVar209),0);
                          fVar209 = auVar118._0_4_;
                          fVar210 = auVar118._4_4_;
                          fVar149 = auVar118._8_4_;
                          fVar294 = auVar118._12_4_;
                          auVar118 = vshufps_avx(auVar257,auVar257,0);
                          auVar190 = vshufps_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),0);
                          auVar225 = vshufps_avx(ZEXT416((uint)fVar180),ZEXT416((uint)fVar180),0);
                          auVar240._0_4_ =
                               (fVar209 * (fVar209 * auVar169._0_4_ + fVar295 * auVar117._0_4_) +
                               fVar295 * (fVar209 * auVar117._0_4_ + fVar295 * auVar168._0_4_)) *
                               3.0;
                          auVar240._4_4_ =
                               (fVar210 * (fVar210 * auVar169._4_4_ + fVar308 * auVar117._4_4_) +
                               fVar308 * (fVar210 * auVar117._4_4_ + fVar308 * auVar168._4_4_)) *
                               3.0;
                          auVar240._8_4_ =
                               (fVar149 * (fVar149 * auVar169._8_4_ + fVar184 * auVar117._8_4_) +
                               fVar184 * (fVar149 * auVar117._8_4_ + fVar184 * auVar168._8_4_)) *
                               3.0;
                          auVar240._12_4_ =
                               (fVar294 * (fVar294 * auVar169._12_4_ + fVar204 * auVar117._12_4_) +
                               fVar204 * (fVar294 * auVar117._12_4_ + fVar204 * auVar168._12_4_)) *
                               3.0;
                          auVar169 = vshufps_avx(ZEXT416((uint)fVar182),ZEXT416((uint)fVar182),0);
                          auVar197._0_4_ =
                               auVar169._0_4_ * (float)local_400._0_4_ +
                               auVar225._0_4_ * (float)local_410._0_4_ +
                               auVar118._0_4_ * (float)local_430._0_4_ +
                               auVar190._0_4_ * (float)local_420._0_4_;
                          auVar197._4_4_ =
                               auVar169._4_4_ * (float)local_400._4_4_ +
                               auVar225._4_4_ * (float)local_410._4_4_ +
                               auVar118._4_4_ * (float)local_430._4_4_ +
                               auVar190._4_4_ * (float)local_420._4_4_;
                          auVar197._8_4_ =
                               auVar169._8_4_ * fStack_3f8 +
                               auVar225._8_4_ * fStack_408 +
                               auVar118._8_4_ * fStack_428 + auVar190._8_4_ * fStack_418;
                          auVar197._12_4_ =
                               auVar169._12_4_ * fStack_3f4 +
                               auVar225._12_4_ * fStack_404 +
                               auVar118._12_4_ * fStack_424 + auVar190._12_4_ * fStack_414;
                          auVar118 = vshufps_avx(auVar240,auVar240,0xc9);
                          auVar226._0_4_ = auVar197._0_4_ * auVar118._0_4_;
                          auVar226._4_4_ = auVar197._4_4_ * auVar118._4_4_;
                          auVar226._8_4_ = auVar197._8_4_ * auVar118._8_4_;
                          auVar226._12_4_ = auVar197._12_4_ * auVar118._12_4_;
                          auVar118 = vshufps_avx(auVar197,auVar197,0xc9);
                          auVar198._0_4_ = auVar240._0_4_ * auVar118._0_4_;
                          auVar198._4_4_ = auVar240._4_4_ * auVar118._4_4_;
                          auVar198._8_4_ = auVar240._8_4_ * auVar118._8_4_;
                          auVar198._12_4_ = auVar240._12_4_ * auVar118._12_4_;
                          auVar118 = vsubps_avx(auVar198,auVar226);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x100) = fVar178;
                            uVar4 = vextractps_avx(auVar118,1);
                            *(undefined4 *)(ray + k * 4 + 0x180) = uVar4;
                            uVar4 = vextractps_avx(auVar118,2);
                            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar4;
                            *(int *)(ray + k * 4 + 0x1c0) = auVar118._0_4_;
                            *(float *)(ray + k * 4 + 0x1e0) = fVar103;
                            *(float *)(ray + k * 4 + 0x200) = fVar176;
                            *(uint *)(ray + k * 4 + 0x220) = uVar8;
                            *(uint *)(ray + k * 4 + 0x240) = uVar74;
                            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                            goto LAB_010950fb;
                          }
                          auStack_170 = vshufps_avx(auVar118,auVar118,0x55);
                          auStack_150 = vshufps_avx(auVar118,auVar118,0xaa);
                          auStack_130 = vshufps_avx(auVar118,auVar118,0);
                          local_180[0] = (RTCHitN)auStack_170[0];
                          local_180[1] = (RTCHitN)auStack_170[1];
                          local_180[2] = (RTCHitN)auStack_170[2];
                          local_180[3] = (RTCHitN)auStack_170[3];
                          local_180[4] = (RTCHitN)auStack_170[4];
                          local_180[5] = (RTCHitN)auStack_170[5];
                          local_180[6] = (RTCHitN)auStack_170[6];
                          local_180[7] = (RTCHitN)auStack_170[7];
                          local_180[8] = (RTCHitN)auStack_170[8];
                          local_180[9] = (RTCHitN)auStack_170[9];
                          local_180[10] = (RTCHitN)auStack_170[10];
                          local_180[0xb] = (RTCHitN)auStack_170[0xb];
                          local_180[0xc] = (RTCHitN)auStack_170[0xc];
                          local_180[0xd] = (RTCHitN)auStack_170[0xd];
                          local_180[0xe] = (RTCHitN)auStack_170[0xe];
                          local_180[0xf] = (RTCHitN)auStack_170[0xf];
                          local_160 = auStack_150;
                          local_140 = auStack_130;
                          local_120 = auStack_110;
                          local_100 = auStack_f0;
                          local_e0 = local_2e0._0_8_;
                          uStack_d8 = local_2e0._8_8_;
                          uStack_d0 = local_2e0._16_8_;
                          uStack_c8 = local_2e0._24_8_;
                          local_c0 = local_2c0._0_8_;
                          uStack_b8 = local_2c0._8_8_;
                          uStack_b0 = local_2c0._16_8_;
                          uStack_a8 = local_2c0._24_8_;
                          auVar95 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                          uStack_9c = context->user->instID[0];
                          local_a0 = uStack_9c;
                          uStack_98 = uStack_9c;
                          uStack_94 = uStack_9c;
                          uStack_90 = uStack_9c;
                          uStack_8c = uStack_9c;
                          uStack_84 = auVar95._28_4_;
                          uVar67 = uStack_84;
                          uStack_88 = uStack_9c;
                          uStack_84 = uStack_9c;
                          uStack_7c = context->user->instPrimID[0];
                          local_80 = uStack_7c;
                          uStack_78 = uStack_7c;
                          uStack_74 = uStack_7c;
                          uStack_70 = uStack_7c;
                          uStack_6c = uStack_7c;
                          uStack_68 = uStack_7c;
                          uStack_64 = uStack_7c;
                          *(float *)(ray + k * 4 + 0x100) = fVar178;
                          local_500 = *(undefined8 *)(mm_lookupmask_ps + uVar68);
                          uStack_4f8 = *(undefined8 *)(mm_lookupmask_ps + uVar68 + 8);
                          local_4f0 = *(undefined8 *)(mm_lookupmask_ps + lVar72);
                          uStack_4e8 = *(undefined8 *)(mm_lookupmask_ps + lVar72 + 8);
                          local_4e0.valid = (int *)&local_500;
                          local_4e0.geometryUserPtr = pGVar9->userPtr;
                          local_4e0.context = context->user;
                          local_4e0.hit = local_180;
                          local_4e0.N = 8;
                          local_4e0.ray = (RTCRayN *)ray;
                          if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar9->intersectionFilterN)(&local_4e0);
                            auVar363 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          auVar62._8_8_ = uStack_4f8;
                          auVar62._0_8_ = local_500;
                          auVar118 = vpcmpeqd_avx(auVar363._0_16_,auVar62);
                          auVar64._8_8_ = uStack_4e8;
                          auVar64._0_8_ = local_4f0;
                          auVar190 = vpcmpeqd_avx(auVar363._0_16_,auVar64);
                          auVar99._16_16_ = auVar190;
                          auVar99._0_16_ = auVar118;
                          auVar21 = auVar95 & ~auVar99;
                          if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar21 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar21 >> 0x7f,0) == '\0') &&
                                (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar21 >> 0xbf,0) == '\0') &&
                              (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                              -1 < auVar21[0x1f]) {
                            auVar100._0_4_ = auVar118._0_4_ ^ auVar95._0_4_;
                            auVar100._4_4_ = auVar118._4_4_ ^ auVar95._4_4_;
                            auVar100._8_4_ = auVar118._8_4_ ^ auVar95._8_4_;
                            auVar100._12_4_ = auVar118._12_4_ ^ auVar95._12_4_;
                            auVar100._16_4_ = auVar190._0_4_ ^ auVar95._16_4_;
                            auVar100._20_4_ = auVar190._4_4_ ^ auVar95._20_4_;
                            auVar100._24_4_ = auVar190._8_4_ ^ auVar95._24_4_;
                            auVar100._28_4_ = auVar190._12_4_ ^ uVar67;
                          }
                          else {
                            p_Var14 = context->args->filter;
                            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var14)(&local_4e0);
                              auVar363 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            auVar63._8_8_ = uStack_4f8;
                            auVar63._0_8_ = local_500;
                            auVar118 = vpcmpeqd_avx(auVar363._0_16_,auVar63);
                            auVar65._8_8_ = uStack_4e8;
                            auVar65._0_8_ = local_4f0;
                            auVar190 = vpcmpeqd_avx(auVar363._0_16_,auVar65);
                            auVar129._16_16_ = auVar190;
                            auVar129._0_16_ = auVar118;
                            auVar100._0_4_ = auVar118._0_4_ ^ auVar95._0_4_;
                            auVar100._4_4_ = auVar118._4_4_ ^ auVar95._4_4_;
                            auVar100._8_4_ = auVar118._8_4_ ^ auVar95._8_4_;
                            auVar100._12_4_ = auVar118._12_4_ ^ auVar95._12_4_;
                            auVar100._16_4_ = auVar190._0_4_ ^ auVar95._16_4_;
                            auVar100._20_4_ = auVar190._4_4_ ^ auVar95._20_4_;
                            auVar100._24_4_ = auVar190._8_4_ ^ auVar95._24_4_;
                            auVar100._28_4_ = auVar190._12_4_ ^ uVar67;
                            auVar95 = auVar95 & ~auVar129;
                            if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0 ||
                                     (auVar95 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar95 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar95 >> 0x7f,0) != '\0') ||
                                  (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                                  ) || SUB321(auVar95 >> 0xbf,0) != '\0') ||
                                (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                                || auVar95[0x1f] < '\0') {
                              auVar95 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])local_4e0.hit)
                              ;
                              *(undefined1 (*) [32])(local_4e0.ray + 0x180) = auVar95;
                              auVar95 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])
                                                                 (local_4e0.hit + 0x20));
                              *(undefined1 (*) [32])(local_4e0.ray + 0x1a0) = auVar95;
                              auVar95 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])
                                                                 (local_4e0.hit + 0x40));
                              *(undefined1 (*) [32])(local_4e0.ray + 0x1c0) = auVar95;
                              auVar95 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])
                                                                 (local_4e0.hit + 0x60));
                              *(undefined1 (*) [32])(local_4e0.ray + 0x1e0) = auVar95;
                              auVar95 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])
                                                                 (local_4e0.hit + 0x80));
                              *(undefined1 (*) [32])(local_4e0.ray + 0x200) = auVar95;
                              auVar95 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])
                                                                 (local_4e0.hit + 0xa0));
                              *(undefined1 (*) [32])(local_4e0.ray + 0x220) = auVar95;
                              auVar95 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])
                                                                 (local_4e0.hit + 0xc0));
                              *(undefined1 (*) [32])(local_4e0.ray + 0x240) = auVar95;
                              auVar95 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])
                                                                 (local_4e0.hit + 0xe0));
                              *(undefined1 (*) [32])(local_4e0.ray + 0x260) = auVar95;
                              auVar95 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])
                                                                 (local_4e0.hit + 0x100));
                              *(undefined1 (*) [32])(local_4e0.ray + 0x280) = auVar95;
                            }
                          }
                          if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar100 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar100 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar100 >> 0x7f,0) == '\0') &&
                                (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar100 >> 0xbf,0) == '\0') &&
                              (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar100[0x1f]) {
                            *(float *)(ray + k * 4 + 0x100) = fVar206;
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar70 = lVar70 + -1;
                } while (lVar70 != 0);
              }
              goto LAB_01095110;
            }
          }
          goto LAB_01095126;
        }
      }
LAB_01095110:
    } while (bVar53);
    _local_680 = ZEXT416((uint)fVar150);
    local_3e0 = vinsertps_avx(_local_680,ZEXT416((uint)fVar101),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }